

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  bool bVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  long lVar59;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  undefined1 auVar63 [8];
  bool bVar64;
  float fVar65;
  undefined4 uVar66;
  float fVar67;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar89 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar100 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  vint4 ai_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  vint4 ai;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar156;
  float fVar158;
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar160;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar155 [32];
  undefined8 uVar164;
  vfloat4 a0_3;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar180;
  undefined1 auVar178 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar207 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar231;
  vfloat4 a0_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  float fVar250;
  float fVar260;
  float fVar261;
  vfloat4 a0;
  undefined1 auVar251 [16];
  float fVar262;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar263;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar273;
  undefined1 auVar264 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar277 [16];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined4 local_548;
  undefined1 local_4c8 [16];
  int local_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  float local_488;
  float fStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [32];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  long local_438;
  Primitive *local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  ulong local_330;
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [32];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar58;
  undefined1 auVar122 [32];
  float fVar184;
  float fVar201;
  
  PVar3 = prim[1];
  uVar62 = (ulong)(byte)PVar3;
  fVar141 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar143._0_4_ = fVar141 * (ray->dir).field_0.m128[0];
  auVar143._4_4_ = fVar141 * (ray->dir).field_0.m128[1];
  auVar143._8_4_ = fVar141 * (ray->dir).field_0.m128[2];
  auVar143._12_4_ = fVar141 * (ray->dir).field_0.m128[3];
  auVar68._0_4_ = fVar141 * auVar12._0_4_;
  auVar68._4_4_ = fVar141 * auVar12._4_4_;
  auVar68._8_4_ = fVar141 * auVar12._8_4_;
  auVar68._12_4_ = fVar141 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar276 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar276 = vcvtdq2ps_avx(auVar276);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar62 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar57 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + uVar62 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar57 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar274._4_4_ = auVar143._0_4_;
  auVar274._0_4_ = auVar143._0_4_;
  auVar274._8_4_ = auVar143._0_4_;
  auVar274._12_4_ = auVar143._0_4_;
  auVar87 = vshufps_avx(auVar143,auVar143,0x55);
  auVar69 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar141 = auVar69._0_4_;
  auVar240._0_4_ = fVar141 * auVar276._0_4_;
  fVar157 = auVar69._4_4_;
  auVar240._4_4_ = fVar157 * auVar276._4_4_;
  fVar159 = auVar69._8_4_;
  auVar240._8_4_ = fVar159 * auVar276._8_4_;
  fVar161 = auVar69._12_4_;
  auVar240._12_4_ = fVar161 * auVar276._12_4_;
  auVar232._0_4_ = auVar11._0_4_ * fVar141;
  auVar232._4_4_ = auVar11._4_4_ * fVar157;
  auVar232._8_4_ = auVar11._8_4_ * fVar159;
  auVar232._12_4_ = auVar11._12_4_ * fVar161;
  auVar202._0_4_ = auVar99._0_4_ * fVar141;
  auVar202._4_4_ = auVar99._4_4_ * fVar157;
  auVar202._8_4_ = auVar99._8_4_ * fVar159;
  auVar202._12_4_ = auVar99._12_4_ * fVar161;
  auVar69 = vfmadd231ps_fma(auVar240,auVar87,auVar8);
  auVar210 = vfmadd231ps_fma(auVar232,auVar87,auVar10);
  auVar87 = vfmadd231ps_fma(auVar202,auVar70,auVar87);
  auVar113 = vfmadd231ps_fma(auVar69,auVar274,auVar12);
  auVar210 = vfmadd231ps_fma(auVar210,auVar274,auVar9);
  auVar126 = vfmadd231ps_fma(auVar87,auVar71,auVar274);
  auVar275._4_4_ = auVar68._0_4_;
  auVar275._0_4_ = auVar68._0_4_;
  auVar275._8_4_ = auVar68._0_4_;
  auVar275._12_4_ = auVar68._0_4_;
  auVar87 = vshufps_avx(auVar68,auVar68,0x55);
  auVar69 = vshufps_avx(auVar68,auVar68,0xaa);
  fVar141 = auVar69._0_4_;
  auVar144._0_4_ = fVar141 * auVar276._0_4_;
  fVar157 = auVar69._4_4_;
  auVar144._4_4_ = fVar157 * auVar276._4_4_;
  fVar159 = auVar69._8_4_;
  auVar144._8_4_ = fVar159 * auVar276._8_4_;
  fVar161 = auVar69._12_4_;
  auVar144._12_4_ = fVar161 * auVar276._12_4_;
  auVar130._0_4_ = auVar11._0_4_ * fVar141;
  auVar130._4_4_ = auVar11._4_4_ * fVar157;
  auVar130._8_4_ = auVar11._8_4_ * fVar159;
  auVar130._12_4_ = auVar11._12_4_ * fVar161;
  auVar69._0_4_ = auVar99._0_4_ * fVar141;
  auVar69._4_4_ = auVar99._4_4_ * fVar157;
  auVar69._8_4_ = auVar99._8_4_ * fVar159;
  auVar69._12_4_ = auVar99._12_4_ * fVar161;
  auVar8 = vfmadd231ps_fma(auVar144,auVar87,auVar8);
  auVar276 = vfmadd231ps_fma(auVar130,auVar87,auVar10);
  auVar10 = vfmadd231ps_fma(auVar69,auVar87,auVar70);
  auVar11 = vfmadd231ps_fma(auVar8,auVar275,auVar12);
  auVar70 = vfmadd231ps_fma(auVar276,auVar275,auVar9);
  auVar99 = vfmadd231ps_fma(auVar10,auVar275,auVar71);
  local_358._8_4_ = 0x7fffffff;
  local_358._0_8_ = 0x7fffffff7fffffff;
  local_358._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar113,local_358);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar8 = vblendvps_avx(auVar113,auVar125,auVar12);
  auVar12 = vandps_avx(auVar210,local_358);
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar276 = vblendvps_avx(auVar210,auVar125,auVar12);
  auVar12 = vandps_avx(auVar126,local_358);
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar12 = vblendvps_avx(auVar126,auVar125,auVar12);
  auVar9 = vrcpps_avx(auVar8);
  auVar185._8_4_ = 0x3f800000;
  auVar185._0_8_ = &DAT_3f8000003f800000;
  auVar185._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar185);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar276);
  auVar276 = vfnmadd213ps_fma(auVar276,auVar8,auVar185);
  auVar10 = vfmadd132ps_fma(auVar276,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar12);
  auVar276 = vfnmadd213ps_fma(auVar12,auVar8,auVar185);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar71 = vfmadd132ps_fma(auVar276,auVar8,auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar126._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar126._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar126._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar126._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar145._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar145._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar145._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar145._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar210._1_3_ = 0;
  auVar210[0] = PVar3;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar276);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar62 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar70);
  auVar203._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar203._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar203._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar203._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar8);
  auVar12 = vsubps_avx(auVar12,auVar70);
  auVar87._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar87._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar87._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar87._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar57 + uVar62 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar99);
  auVar113._0_4_ = auVar71._0_4_ * auVar12._0_4_;
  auVar113._4_4_ = auVar71._4_4_ * auVar12._4_4_;
  auVar113._8_4_ = auVar71._8_4_ * auVar12._8_4_;
  auVar113._12_4_ = auVar71._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar99);
  auVar70._0_4_ = auVar71._0_4_ * auVar12._0_4_;
  auVar70._4_4_ = auVar71._4_4_ * auVar12._4_4_;
  auVar70._8_4_ = auVar71._8_4_ * auVar12._8_4_;
  auVar70._12_4_ = auVar71._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar126,auVar145);
  auVar8 = vpminsd_avx(auVar203,auVar87);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vpminsd_avx(auVar113,auVar70);
  uVar66 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar220._4_4_ = uVar66;
  auVar220._0_4_ = uVar66;
  auVar220._8_4_ = uVar66;
  auVar220._12_4_ = uVar66;
  auVar8 = vmaxps_avx(auVar8,auVar220);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  local_258._0_4_ = auVar12._0_4_ * 0.99999964;
  local_258._4_4_ = auVar12._4_4_ * 0.99999964;
  local_258._8_4_ = auVar12._8_4_ * 0.99999964;
  local_258._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar126,auVar145);
  auVar8 = vpmaxsd_avx(auVar203,auVar87);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar8 = vpmaxsd_avx(auVar113,auVar70);
  fVar141 = ray->tfar;
  auVar99._4_4_ = fVar141;
  auVar99._0_4_ = fVar141;
  auVar99._8_4_ = fVar141;
  auVar99._12_4_ = fVar141;
  auVar8 = vminps_avx(auVar8,auVar99);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar71._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar71._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar71._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar71._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar210[4] = PVar3;
  auVar210._5_3_ = 0;
  auVar210[8] = PVar3;
  auVar210._9_3_ = 0;
  auVar210[0xc] = PVar3;
  auVar210._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar210,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_258,auVar71,2);
  auVar12 = vandps_avx(auVar12,auVar8);
  uVar54 = vmovmskps_avx(auVar12);
  bVar64 = uVar54 != 0;
  if (uVar54 == 0) {
    return bVar64;
  }
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  uVar54 = uVar54 & 0xff;
  local_1f8 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  local_368 = 0x80000000;
  uStack_364 = 0x80000000;
  uStack_360 = 0x80000000;
  uStack_35c = 0x80000000;
  local_430 = prim;
LAB_016a7b99:
  lVar59 = 0;
  auVar63 = (undefined1  [8])(ulong)uVar54;
  for (uVar57 = (ulong)auVar63; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar54 = *(uint *)(local_430 + 2);
  local_330 = (ulong)*(uint *)(local_430 + lVar59 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar54].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_330 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar57);
  lVar59 = uVar57 + 1;
  auVar8 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar59);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar276 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar57);
  auVar9 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar59);
  auVar72._8_4_ = 0x3eaaaaab;
  auVar72._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar72._12_4_ = 0x3eaaaaab;
  auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar57),auVar12,auVar72);
  auVar99 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * lVar59),auVar8,auVar72);
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar4[3].userPtr +
                             uVar57 * *(long *)&pGVar4[3].fnumTimeSegments),auVar276,auVar72);
  auVar87 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              *(long *)&pGVar4[3].fnumTimeSegments * lVar59),auVar9,auVar72);
  auVar210 = ZEXT816(0) << 0x40;
  auVar73._0_4_ = auVar8._0_4_ * 0.0;
  auVar73._4_4_ = auVar8._4_4_ * 0.0;
  auVar73._8_4_ = auVar8._8_4_ * 0.0;
  auVar73._12_4_ = auVar8._12_4_ * 0.0;
  auVar70 = vfmadd231ps_fma(auVar73,auVar99,auVar210);
  auVar71 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar70);
  local_448._0_4_ = auVar12._0_4_ + auVar71._0_4_;
  local_448._4_4_ = auVar12._4_4_ + auVar71._4_4_;
  fStack_440 = auVar12._8_4_ + auVar71._8_4_;
  fStack_43c = auVar12._12_4_ + auVar71._12_4_;
  auVar264._8_4_ = 0x40400000;
  auVar264._0_8_ = 0x4040000040400000;
  auVar264._12_4_ = 0x40400000;
  auVar71 = vfmadd231ps_fma(auVar70,auVar10,auVar264);
  auVar69 = vfnmadd231ps_fma(auVar71,auVar12,auVar264);
  auVar221._0_4_ = auVar9._0_4_ * 0.0;
  auVar221._4_4_ = auVar9._4_4_ * 0.0;
  auVar221._8_4_ = auVar9._8_4_ * 0.0;
  auVar221._12_4_ = auVar9._12_4_ * 0.0;
  auVar70 = vfmadd231ps_fma(auVar221,auVar87,auVar210);
  auVar71 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar70);
  auVar251._0_4_ = auVar276._0_4_ + auVar71._0_4_;
  auVar251._4_4_ = auVar276._4_4_ + auVar71._4_4_;
  auVar251._8_4_ = auVar276._8_4_ + auVar71._8_4_;
  auVar251._12_4_ = auVar276._12_4_ + auVar71._12_4_;
  auVar71 = vfmadd231ps_fma(auVar70,auVar11,auVar264);
  auVar70 = vfnmadd231ps_fma(auVar71,auVar276,auVar264);
  auVar71 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar99,auVar8);
  auVar71 = vfmadd231ps_fma(auVar71,auVar10,auVar210);
  auVar71 = vfmadd231ps_fma(auVar71,auVar12,auVar210);
  auVar114._0_4_ = auVar8._0_4_ * 3.0;
  auVar114._4_4_ = auVar8._4_4_ * 3.0;
  auVar114._8_4_ = auVar8._8_4_ * 3.0;
  auVar114._12_4_ = auVar8._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar114,auVar264,auVar99);
  auVar8 = vfmadd231ps_fma(auVar8,auVar210,auVar10);
  auVar99 = vfnmadd231ps_fma(auVar8,auVar210,auVar12);
  auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar87,auVar9);
  auVar12 = vfmadd231ps_fma(auVar12,auVar11,auVar210);
  auVar10 = vfmadd231ps_fma(auVar12,auVar276,auVar210);
  auVar165._0_4_ = auVar9._0_4_ * 3.0;
  auVar165._4_4_ = auVar9._4_4_ * 3.0;
  auVar165._8_4_ = auVar9._8_4_ * 3.0;
  auVar165._12_4_ = auVar9._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar165,auVar264,auVar87);
  auVar12 = vfmadd231ps_fma(auVar12,auVar210,auVar11);
  auVar87 = vfnmadd231ps_fma(auVar12,auVar210,auVar276);
  auVar12 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar8 = vshufps_avx(auVar251,auVar251,0xc9);
  fVar65 = auVar69._0_4_;
  auVar186._0_4_ = fVar65 * auVar8._0_4_;
  fVar86 = auVar69._4_4_;
  auVar186._4_4_ = fVar86 * auVar8._4_4_;
  fVar162 = auVar69._8_4_;
  auVar186._8_4_ = fVar162 * auVar8._8_4_;
  fVar163 = auVar69._12_4_;
  auVar186._12_4_ = fVar163 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar186,auVar12,auVar251);
  auVar276 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar204._0_4_ = auVar8._0_4_ * fVar65;
  auVar204._4_4_ = auVar8._4_4_ * fVar86;
  auVar204._8_4_ = auVar8._8_4_ * fVar162;
  auVar204._12_4_ = auVar8._12_4_ * fVar163;
  auVar12 = vfmsub231ps_fma(auVar204,auVar12,auVar70);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar8 = vshufps_avx(auVar99,auVar99,0xc9);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar141 = auVar99._0_4_;
  auVar222._0_4_ = auVar12._0_4_ * fVar141;
  fVar157 = auVar99._4_4_;
  auVar222._4_4_ = auVar12._4_4_ * fVar157;
  fVar159 = auVar99._8_4_;
  auVar222._8_4_ = auVar12._8_4_ * fVar159;
  fVar161 = auVar99._12_4_;
  auVar222._12_4_ = auVar12._12_4_ * fVar161;
  auVar12 = vfmsub231ps_fma(auVar222,auVar8,auVar10);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar11 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar12 = vdpps_avx(auVar276,auVar276,0x7f);
  auVar223._0_4_ = auVar11._0_4_ * fVar141;
  auVar223._4_4_ = auVar11._4_4_ * fVar157;
  auVar223._8_4_ = auVar11._8_4_ * fVar159;
  auVar223._12_4_ = auVar11._12_4_ * fVar161;
  auVar8 = vfmsub231ps_fma(auVar223,auVar8,auVar87);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  fVar67 = auVar12._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar67;
  auVar8 = vrsqrtss_avx(auVar224,auVar224);
  fVar112 = auVar8._0_4_;
  fVar142 = fVar112 * 1.5 - fVar67 * 0.5 * fVar112 * fVar112 * fVar112;
  auVar8 = vdpps_avx(auVar276,auVar9,0x7f);
  fVar140 = fVar142 * auVar276._0_4_;
  fVar156 = fVar142 * auVar276._4_4_;
  fVar158 = fVar142 * auVar276._8_4_;
  fVar160 = fVar142 * auVar276._12_4_;
  auVar205._0_4_ = fVar67 * auVar9._0_4_;
  auVar205._4_4_ = fVar67 * auVar9._4_4_;
  auVar205._8_4_ = fVar67 * auVar9._8_4_;
  auVar205._12_4_ = fVar67 * auVar9._12_4_;
  fVar112 = auVar8._0_4_;
  auVar187._0_4_ = fVar112 * auVar276._0_4_;
  auVar187._4_4_ = fVar112 * auVar276._4_4_;
  auVar187._8_4_ = fVar112 * auVar276._8_4_;
  auVar187._12_4_ = fVar112 * auVar276._12_4_;
  auVar276 = vsubps_avx(auVar205,auVar187);
  auVar8 = vrcpss_avx(auVar224,auVar224);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar112 = auVar8._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar67 = auVar12._0_4_;
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = fVar67;
  auVar8 = vrsqrtss_avx(auVar225,auVar225);
  fVar179 = auVar8._0_4_;
  fVar179 = fVar179 * 1.5 - fVar67 * 0.5 * fVar179 * fVar179 * fVar179;
  auVar8 = vdpps_avx(auVar10,auVar11,0x7f);
  fVar250 = fVar179 * auVar10._0_4_;
  fVar260 = fVar179 * auVar10._4_4_;
  fVar261 = fVar179 * auVar10._8_4_;
  fVar262 = fVar179 * auVar10._12_4_;
  auVar166._0_4_ = fVar67 * auVar11._0_4_;
  auVar166._4_4_ = fVar67 * auVar11._4_4_;
  auVar166._8_4_ = fVar67 * auVar11._8_4_;
  auVar166._12_4_ = fVar67 * auVar11._12_4_;
  fVar67 = auVar8._0_4_;
  auVar127._0_4_ = fVar67 * auVar10._0_4_;
  auVar127._4_4_ = fVar67 * auVar10._4_4_;
  auVar127._8_4_ = fVar67 * auVar10._8_4_;
  auVar127._12_4_ = fVar67 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar166,auVar127);
  auVar8 = vrcpss_avx(auVar225,auVar225);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,ZEXT416(0x40000000));
  fVar67 = auVar12._0_4_ * auVar8._0_4_;
  auVar12 = vshufps_avx(_local_448,_local_448,0xff);
  auVar206._0_4_ = auVar12._0_4_ * fVar140;
  auVar206._4_4_ = auVar12._4_4_ * fVar156;
  auVar206._8_4_ = auVar12._8_4_ * fVar158;
  auVar206._12_4_ = auVar12._12_4_ * fVar160;
  local_378 = vsubps_avx(_local_448,auVar206);
  auVar8 = vshufps_avx(auVar69,auVar69,0xff);
  auVar146._0_4_ = auVar8._0_4_ * fVar140 + auVar12._0_4_ * fVar142 * fVar112 * auVar276._0_4_;
  auVar146._4_4_ = auVar8._4_4_ * fVar156 + auVar12._4_4_ * fVar142 * fVar112 * auVar276._4_4_;
  auVar146._8_4_ = auVar8._8_4_ * fVar158 + auVar12._8_4_ * fVar142 * fVar112 * auVar276._8_4_;
  auVar146._12_4_ = auVar8._12_4_ * fVar160 + auVar12._12_4_ * fVar142 * fVar112 * auVar276._12_4_;
  auVar276 = vsubps_avx(auVar69,auVar146);
  local_388._0_4_ = auVar206._0_4_ + (float)local_448._0_4_;
  local_388._4_4_ = auVar206._4_4_ + (float)local_448._4_4_;
  fStack_380 = auVar206._8_4_ + fStack_440;
  fStack_37c = auVar206._12_4_ + fStack_43c;
  auVar12 = vshufps_avx(auVar71,auVar71,0xff);
  auVar88._0_4_ = fVar250 * auVar12._0_4_;
  auVar88._4_4_ = fVar260 * auVar12._4_4_;
  auVar88._8_4_ = fVar261 * auVar12._8_4_;
  auVar88._12_4_ = fVar262 * auVar12._12_4_;
  local_398 = vsubps_avx(auVar71,auVar88);
  auVar8 = vshufps_avx(auVar99,auVar99,0xff);
  auVar74._0_4_ = fVar250 * auVar8._0_4_ + auVar12._0_4_ * fVar179 * auVar9._0_4_ * fVar67;
  auVar74._4_4_ = fVar260 * auVar8._4_4_ + auVar12._4_4_ * fVar179 * auVar9._4_4_ * fVar67;
  auVar74._8_4_ = fVar261 * auVar8._8_4_ + auVar12._8_4_ * fVar179 * auVar9._8_4_ * fVar67;
  auVar74._12_4_ = fVar262 * auVar8._12_4_ + auVar12._12_4_ * fVar179 * auVar9._12_4_ * fVar67;
  auVar12 = vsubps_avx(auVar99,auVar74);
  local_3e8 = auVar71._0_4_ + auVar88._0_4_;
  fStack_3e4 = auVar71._4_4_ + auVar88._4_4_;
  fStack_3e0 = auVar71._8_4_ + auVar88._8_4_;
  fStack_3dc = auVar71._12_4_ + auVar88._12_4_;
  local_3a8._0_4_ = local_378._0_4_ + auVar276._0_4_ * 0.33333334;
  local_3a8._4_4_ = local_378._4_4_ + auVar276._4_4_ * 0.33333334;
  local_3a8._8_4_ = local_378._8_4_ + auVar276._8_4_ * 0.33333334;
  local_3a8._12_4_ = local_378._12_4_ + auVar276._12_4_ * 0.33333334;
  auVar75._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar12._12_4_ * 0.33333334;
  local_3b8 = vsubps_avx(local_398,auVar75);
  aVar1 = (ray->org).field_0;
  auVar276 = vsubps_avx(local_378,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar276,auVar276,0x55);
  auVar8 = vshufps_avx(auVar276,auVar276,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar112 = (pre->ray_space).vz.field_0.m128[0];
  fVar67 = (pre->ray_space).vz.field_0.m128[1];
  fVar142 = (pre->ray_space).vz.field_0.m128[2];
  fVar179 = (pre->ray_space).vz.field_0.m128[3];
  auVar76._0_4_ = fVar112 * auVar8._0_4_;
  auVar76._4_4_ = fVar67 * auVar8._4_4_;
  auVar76._8_4_ = fVar142 * auVar8._8_4_;
  auVar76._12_4_ = fVar179 * auVar8._12_4_;
  auVar87 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_3a8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar77._0_4_ = fVar112 * auVar8._0_4_;
  auVar77._4_4_ = fVar67 * auVar8._4_4_;
  auVar77._8_4_ = fVar142 * auVar8._8_4_;
  auVar77._12_4_ = fVar179 * auVar8._12_4_;
  auVar69 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_3b8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar78._0_4_ = fVar112 * auVar12._0_4_;
  auVar78._4_4_ = fVar67 * auVar12._4_4_;
  auVar78._8_4_ = fVar142 * auVar12._8_4_;
  auVar78._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar210 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(local_398,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar79._0_4_ = fVar112 * auVar12._0_4_;
  auVar79._4_4_ = fVar67 * auVar12._4_4_;
  auVar79._8_4_ = fVar142 * auVar12._8_4_;
  auVar79._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar113 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar2,auVar12);
  auVar11 = vsubps_avx(_local_388,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar147._0_4_ = fVar112 * auVar12._0_4_;
  auVar147._4_4_ = fVar67 * auVar12._4_4_;
  auVar147._8_4_ = fVar142 * auVar12._8_4_;
  auVar147._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar126 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar12);
  local_3c8._0_4_ = (fVar65 + auVar146._0_4_) * 0.33333334 + (float)local_388._0_4_;
  local_3c8._4_4_ = (fVar86 + auVar146._4_4_) * 0.33333334 + (float)local_388._4_4_;
  fStack_3c0 = (fVar162 + auVar146._8_4_) * 0.33333334 + fStack_380;
  fStack_3bc = (fVar163 + auVar146._12_4_) * 0.33333334 + fStack_37c;
  auVar71 = vsubps_avx(_local_3c8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar233._0_4_ = fVar112 * auVar12._0_4_;
  auVar233._4_4_ = fVar67 * auVar12._4_4_;
  auVar233._8_4_ = fVar142 * auVar12._8_4_;
  auVar233._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar71,auVar71,0x55);
  auVar68 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar2,auVar12);
  auVar241._0_4_ = (fVar141 + auVar74._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar157 + auVar74._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar159 + auVar74._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar161 + auVar74._12_4_) * 0.33333334;
  auVar46._4_4_ = fStack_3e4;
  auVar46._0_4_ = local_3e8;
  auVar46._8_4_ = fStack_3e0;
  auVar46._12_4_ = fStack_3dc;
  _local_3d8 = vsubps_avx(auVar46,auVar241);
  auVar70 = vsubps_avx(_local_3d8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar242._0_4_ = fVar112 * auVar12._0_4_;
  auVar242._4_4_ = fVar67 * auVar12._4_4_;
  auVar242._8_4_ = fVar142 * auVar12._8_4_;
  auVar242._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar70,auVar70,0x55);
  auVar130 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar2,auVar12);
  auVar99 = vsubps_avx(auVar46,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar99,auVar99,0xaa);
  auVar188._0_4_ = fVar112 * auVar12._0_4_;
  auVar188._4_4_ = fVar67 * auVar12._4_4_;
  auVar188._8_4_ = fVar142 * auVar12._8_4_;
  auVar188._12_4_ = fVar179 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar99,auVar99,0x55);
  auVar12 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar2,auVar12);
  local_448._0_4_ = auVar276._0_4_;
  auVar167._4_4_ = local_448._0_4_;
  auVar167._0_4_ = local_448._0_4_;
  auVar167._8_4_ = local_448._0_4_;
  auVar167._12_4_ = local_448._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar87 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar2,auVar167);
  local_548 = auVar9._0_4_;
  auVar168._4_4_ = local_548;
  auVar168._0_4_ = local_548;
  auVar168._8_4_ = local_548;
  auVar168._12_4_ = local_548;
  auVar9 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar168);
  uVar66 = auVar8._0_4_;
  auVar169._4_4_ = uVar66;
  auVar169._0_4_ = uVar66;
  auVar169._8_4_ = uVar66;
  auVar169._12_4_ = uVar66;
  auVar69 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar2,auVar169);
  uVar66 = auVar10._0_4_;
  auVar170._4_4_ = uVar66;
  auVar170._0_4_ = uVar66;
  auVar170._8_4_ = uVar66;
  auVar170._12_4_ = uVar66;
  auVar10 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar2,auVar170);
  uVar66 = auVar11._0_4_;
  auVar171._4_4_ = uVar66;
  auVar171._0_4_ = uVar66;
  auVar171._8_4_ = uVar66;
  auVar171._12_4_ = uVar66;
  auVar11 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar2,auVar171);
  uVar66 = auVar71._0_4_;
  auVar172._4_4_ = uVar66;
  auVar172._0_4_ = uVar66;
  auVar172._8_4_ = uVar66;
  auVar172._12_4_ = uVar66;
  auVar71 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar2,auVar172);
  uVar66 = auVar70._0_4_;
  auVar80._4_4_ = uVar66;
  auVar80._0_4_ = uVar66;
  auVar80._8_4_ = uVar66;
  auVar80._12_4_ = uVar66;
  auVar70 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar2,auVar80);
  uVar66 = auVar99._0_4_;
  auVar81._4_4_ = uVar66;
  auVar81._0_4_ = uVar66;
  auVar81._8_4_ = uVar66;
  auVar81._12_4_ = uVar66;
  auVar99 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar81);
  local_498 = vmovlhps_avx(auVar87,auVar11);
  local_4a8 = vmovlhps_avx(auVar9,auVar71);
  local_348 = vmovlhps_avx(auVar69,auVar70);
  _local_238 = vmovlhps_avx(auVar10,auVar99);
  auVar280 = ZEXT1664(_local_238);
  auVar12 = vminps_avx(local_498,local_4a8);
  auVar8 = vminps_avx(local_348,_local_238);
  auVar276 = vminps_avx(auVar12,auVar8);
  auVar12 = vmaxps_avx(local_498,local_4a8);
  auVar8 = vmaxps_avx(local_348,_local_238);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vshufpd_avx(auVar276,auVar276,3);
  auVar276 = vminps_avx(auVar276,auVar8);
  auVar8 = vshufpd_avx(auVar12,auVar12,3);
  auVar8 = vmaxps_avx(auVar12,auVar8);
  auVar12 = vandps_avx(local_358,auVar276);
  auVar8 = vandps_avx(local_358,auVar8);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar8,auVar12);
  local_438 = (long)auVar63 + 0xf;
  local_198 = auVar12._0_4_ * 9.536743e-07;
  auVar282._8_8_ = auVar87._0_8_;
  auVar282._0_8_ = auVar87._0_8_;
  auVar207._8_8_ = auVar9._0_8_;
  auVar207._0_8_ = auVar9._0_8_;
  auVar89._8_8_ = auVar69._0_8_;
  auVar89._0_8_ = auVar69._0_8_;
  auVar100._8_8_ = auVar10._0_8_;
  auVar100._0_8_ = auVar10._0_8_;
  _local_448 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_368;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  bVar52 = false;
  uVar57 = 0;
  local_208 = vsubps_avx(local_4a8,local_498);
  local_218 = vsubps_avx(local_348,local_4a8);
  local_228 = vsubps_avx(_local_238,local_348);
  local_268 = vsubps_avx(_local_388,local_378);
  local_278 = vsubps_avx(_local_3c8,local_3a8);
  local_288 = vsubps_avx(_local_3d8,local_3b8);
  auVar47._4_4_ = fStack_3e4;
  auVar47._0_4_ = local_3e8;
  auVar47._8_4_ = fStack_3e0;
  auVar47._12_4_ = fStack_3dc;
  _local_298 = vsubps_avx(auVar47,local_398);
  local_4c8 = ZEXT816(0x3f80000000000000);
  local_248 = local_4c8;
  do {
    auVar12 = vshufps_avx(local_4c8,local_4c8,0x50);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar122._16_4_ = 0x3f800000;
    auVar122._0_16_ = auVar115;
    auVar122._20_4_ = 0x3f800000;
    auVar122._24_4_ = 0x3f800000;
    auVar122._28_4_ = 0x3f800000;
    auVar8 = vsubps_avx(auVar115,auVar12);
    fVar141 = auVar12._0_4_;
    fVar65 = auVar11._0_4_;
    auVar82._0_4_ = fVar65 * fVar141;
    fVar157 = auVar12._4_4_;
    fVar86 = auVar11._4_4_;
    auVar82._4_4_ = fVar86 * fVar157;
    fVar159 = auVar12._8_4_;
    auVar82._8_4_ = fVar65 * fVar159;
    fVar161 = auVar12._12_4_;
    auVar82._12_4_ = fVar86 * fVar161;
    fVar263 = auVar71._0_4_;
    auVar148._0_4_ = fVar263 * fVar141;
    fVar273 = auVar71._4_4_;
    auVar148._4_4_ = fVar273 * fVar157;
    auVar148._8_4_ = fVar263 * fVar159;
    auVar148._12_4_ = fVar273 * fVar161;
    fVar184 = auVar70._0_4_;
    auVar189._0_4_ = fVar184 * fVar141;
    fVar201 = auVar70._4_4_;
    auVar189._4_4_ = fVar201 * fVar157;
    auVar189._8_4_ = fVar184 * fVar159;
    auVar189._12_4_ = fVar201 * fVar161;
    fVar219 = auVar99._0_4_;
    auVar252._0_4_ = fVar219 * fVar141;
    fVar231 = auVar99._4_4_;
    auVar252._4_4_ = fVar231 * fVar157;
    auVar252._8_4_ = fVar219 * fVar159;
    auVar252._12_4_ = fVar231 * fVar161;
    auVar10 = vfmadd231ps_fma(auVar82,auVar8,auVar282);
    auVar87 = vfmadd231ps_fma(auVar148,auVar8,auVar207);
    auVar69 = vfmadd231ps_fma(auVar189,auVar8,auVar89);
    auVar210 = vfmadd231ps_fma(auVar252,auVar100,auVar8);
    local_488 = auVar210._0_4_;
    auVar12 = vmovshdup_avx(local_248);
    fVar141 = local_248._0_4_;
    fVar112 = (auVar12._0_4_ - fVar141) * 0.04761905;
    auVar218._4_4_ = fVar141;
    auVar218._0_4_ = fVar141;
    auVar218._8_4_ = fVar141;
    auVar218._12_4_ = fVar141;
    auVar218._16_4_ = fVar141;
    auVar218._20_4_ = fVar141;
    auVar218._24_4_ = fVar141;
    auVar218._28_4_ = fVar141;
    auVar109._0_8_ = auVar12._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    auVar85 = vsubps_avx(auVar109,auVar218);
    uVar66 = auVar10._0_4_;
    auVar286._4_4_ = uVar66;
    auVar286._0_4_ = uVar66;
    auVar286._8_4_ = uVar66;
    auVar286._12_4_ = uVar66;
    auVar286._16_4_ = uVar66;
    auVar286._20_4_ = uVar66;
    auVar286._24_4_ = uVar66;
    auVar286._28_4_ = uVar66;
    auVar12 = vmovshdup_avx(auVar10);
    uVar164 = auVar12._0_8_;
    auVar271._8_8_ = uVar164;
    auVar271._0_8_ = uVar164;
    auVar271._16_8_ = uVar164;
    auVar271._24_8_ = uVar164;
    fVar67 = auVar87._0_4_;
    auVar97._4_4_ = fVar67;
    auVar97._0_4_ = fVar67;
    auVar97._8_4_ = fVar67;
    auVar97._12_4_ = fVar67;
    auVar97._16_4_ = fVar67;
    auVar97._20_4_ = fVar67;
    auVar97._24_4_ = fVar67;
    auVar97._28_4_ = fVar67;
    auVar8 = vmovshdup_avx(auVar87);
    auVar176._0_8_ = auVar8._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar176._16_8_ = auVar176._0_8_;
    auVar176._24_8_ = auVar176._0_8_;
    fVar162 = auVar69._0_4_;
    auVar249._4_4_ = fVar162;
    auVar249._0_4_ = fVar162;
    auVar249._8_4_ = fVar162;
    auVar249._12_4_ = fVar162;
    auVar249._16_4_ = fVar162;
    auVar249._20_4_ = fVar162;
    auVar249._24_4_ = fVar162;
    auVar249._28_4_ = fVar162;
    auVar276 = vmovshdup_avx(auVar69);
    auVar230._0_8_ = auVar276._0_8_;
    auVar230._8_8_ = auVar230._0_8_;
    auVar230._16_8_ = auVar230._0_8_;
    auVar230._24_8_ = auVar230._0_8_;
    auVar9 = vmovshdup_avx(auVar210);
    auVar113 = vfmadd132ps_fma(auVar85,auVar218,_DAT_02020f20);
    auVar85 = vsubps_avx(auVar122,ZEXT1632(auVar113));
    fVar141 = auVar113._0_4_;
    auVar281._0_4_ = fVar67 * fVar141;
    fVar157 = auVar113._4_4_;
    auVar281._4_4_ = fVar67 * fVar157;
    fVar159 = auVar113._8_4_;
    auVar281._8_4_ = fVar67 * fVar159;
    fVar161 = auVar113._12_4_;
    auVar281._12_4_ = fVar67 * fVar161;
    auVar281._16_4_ = fVar67 * 0.0;
    auVar281._20_4_ = fVar67 * 0.0;
    auVar281._28_36_ = auVar280._28_36_;
    auVar281._24_4_ = fVar67 * 0.0;
    auVar113 = vfmadd231ps_fma(auVar281._0_32_,auVar85,auVar286);
    fVar142 = auVar8._0_4_;
    auVar257._0_4_ = fVar142 * fVar141;
    fVar179 = auVar8._4_4_;
    auVar257._4_4_ = fVar179 * fVar157;
    auVar257._8_4_ = fVar142 * fVar159;
    auVar257._12_4_ = fVar179 * fVar161;
    auVar257._16_4_ = fVar142 * 0.0;
    auVar257._20_4_ = fVar179 * 0.0;
    auVar257._24_4_ = fVar142 * 0.0;
    auVar257._28_4_ = 0;
    auVar126 = vfmadd231ps_fma(auVar257,auVar85,auVar271);
    auVar13._4_4_ = fVar162 * fVar157;
    auVar13._0_4_ = fVar162 * fVar141;
    auVar13._8_4_ = fVar162 * fVar159;
    auVar13._12_4_ = fVar162 * fVar161;
    auVar13._16_4_ = fVar162 * 0.0;
    auVar13._20_4_ = fVar162 * 0.0;
    auVar13._24_4_ = fVar162 * 0.0;
    auVar13._28_4_ = auVar12._4_4_;
    auVar68 = vfmadd231ps_fma(auVar13,auVar85,auVar97);
    fVar142 = auVar276._0_4_;
    fVar179 = auVar276._4_4_;
    auVar14._4_4_ = fVar179 * fVar157;
    auVar14._0_4_ = fVar142 * fVar141;
    auVar14._8_4_ = fVar142 * fVar159;
    auVar14._12_4_ = fVar179 * fVar161;
    auVar14._16_4_ = fVar142 * 0.0;
    auVar14._20_4_ = fVar179 * 0.0;
    auVar14._24_4_ = fVar142 * 0.0;
    auVar14._28_4_ = uVar66;
    auVar130 = vfmadd231ps_fma(auVar14,auVar85,auVar176);
    auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar177._0_8_ = auVar12._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar177._16_8_ = auVar177._0_8_;
    auVar177._24_8_ = auVar177._0_8_;
    auVar8 = vshufps_avx(auVar10,auVar10,0xff);
    uStack_400 = auVar8._0_8_;
    local_408 = (undefined1  [8])uStack_400;
    uStack_3f8 = uStack_400;
    uStack_3f0 = uStack_400;
    auVar15._4_4_ = fVar157 * local_488;
    auVar15._0_4_ = fVar141 * local_488;
    auVar15._8_4_ = fVar159 * local_488;
    auVar15._12_4_ = fVar161 * local_488;
    auVar15._16_4_ = local_488 * 0.0;
    auVar15._20_4_ = local_488 * 0.0;
    auVar15._24_4_ = local_488 * 0.0;
    auVar15._28_4_ = 0x3f800000;
    auVar125 = vfmadd231ps_fma(auVar15,auVar85,auVar249);
    auVar276 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar138._0_8_ = auVar276._0_8_;
    auVar138._8_8_ = auVar138._0_8_;
    auVar138._16_8_ = auVar138._0_8_;
    auVar138._24_8_ = auVar138._0_8_;
    auVar10 = vshufps_avx(auVar87,auVar87,0xff);
    auVar155._0_8_ = auVar10._0_8_;
    auVar155._8_8_ = auVar155._0_8_;
    auVar155._16_8_ = auVar155._0_8_;
    auVar155._24_8_ = auVar155._0_8_;
    fVar142 = auVar9._0_4_;
    fVar179 = auVar9._4_4_;
    auVar16._4_4_ = fVar179 * fVar157;
    auVar16._0_4_ = fVar142 * fVar141;
    auVar16._8_4_ = fVar142 * fVar159;
    auVar16._12_4_ = fVar179 * fVar161;
    auVar16._16_4_ = fVar142 * 0.0;
    auVar16._20_4_ = fVar179 * 0.0;
    auVar16._24_4_ = fVar142 * 0.0;
    auVar16._28_4_ = fVar162;
    auVar143 = vfmadd231ps_fma(auVar16,auVar85,auVar230);
    auVar259._28_4_ = fVar67;
    auVar259._0_28_ =
         ZEXT1628(CONCAT412(auVar68._12_4_ * fVar161,
                            CONCAT48(auVar68._8_4_ * fVar159,
                                     CONCAT44(auVar68._4_4_ * fVar157,auVar68._0_4_ * fVar141))));
    auVar113 = vfmadd231ps_fma(auVar259,auVar85,ZEXT1632(auVar113));
    auVar18._28_4_ = auVar8._4_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar130._12_4_ * fVar161,
                            CONCAT48(auVar130._8_4_ * fVar159,
                                     CONCAT44(auVar130._4_4_ * fVar157,auVar130._0_4_ * fVar141))));
    auVar126 = vfmadd231ps_fma(auVar18,auVar85,ZEXT1632(auVar126));
    auVar8 = vshufps_avx(auVar69,auVar69,0xaa);
    uVar164 = auVar8._0_8_;
    auVar258._8_8_ = uVar164;
    auVar258._0_8_ = uVar164;
    auVar258._16_8_ = uVar164;
    auVar258._24_8_ = uVar164;
    auVar9 = vshufps_avx(auVar69,auVar69,0xff);
    uVar164 = auVar9._0_8_;
    auVar278._8_8_ = uVar164;
    auVar278._0_8_ = uVar164;
    auVar278._16_8_ = uVar164;
    auVar278._24_8_ = uVar164;
    auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar125._12_4_,
                                                 CONCAT48(fVar159 * auVar125._8_4_,
                                                          CONCAT44(fVar157 * auVar125._4_4_,
                                                                   fVar141 * auVar125._0_4_)))),
                              auVar85,ZEXT1632(auVar68));
    auVar87 = vshufps_avx(auVar210,auVar210,0xaa);
    auVar69 = vshufps_avx(auVar210,auVar210,0xff);
    local_488 = auVar69._0_4_;
    fStack_484 = auVar69._4_4_;
    auVar19._28_4_ = fStack_484;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar143._12_4_ * fVar161,
                            CONCAT48(auVar143._8_4_ * fVar159,
                                     CONCAT44(auVar143._4_4_ * fVar157,auVar143._0_4_ * fVar141))));
    auVar69 = vfmadd231ps_fma(auVar19,auVar85,ZEXT1632(auVar130));
    auVar210 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar68._12_4_,
                                                  CONCAT48(fVar159 * auVar68._8_4_,
                                                           CONCAT44(fVar157 * auVar68._4_4_,
                                                                    fVar141 * auVar68._0_4_)))),
                               auVar85,ZEXT1632(auVar113));
    auVar13 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar113));
    auVar113 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar69._12_4_,
                                                  CONCAT48(fVar159 * auVar69._8_4_,
                                                           CONCAT44(fVar157 * auVar69._4_4_,
                                                                    fVar141 * auVar69._0_4_)))),
                               auVar85,ZEXT1632(auVar126));
    auVar14 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar126));
    fVar156 = fVar112 * auVar13._0_4_ * 3.0;
    fVar160 = fVar112 * auVar13._4_4_ * 3.0;
    auVar20._4_4_ = fVar160;
    auVar20._0_4_ = fVar156;
    fVar260 = fVar112 * auVar13._8_4_ * 3.0;
    auVar20._8_4_ = fVar260;
    fVar262 = fVar112 * auVar13._12_4_ * 3.0;
    auVar20._12_4_ = fVar262;
    fStack_478 = fVar112 * auVar13._16_4_ * 3.0;
    auVar20._16_4_ = fStack_478;
    fStack_474 = fVar112 * auVar13._20_4_ * 3.0;
    auVar20._20_4_ = fStack_474;
    fStack_470 = fVar112 * auVar13._24_4_ * 3.0;
    auVar20._24_4_ = fStack_470;
    auVar20._28_4_ = 0x40400000;
    local_428._0_4_ = fVar112 * auVar14._0_4_ * 3.0;
    local_428._4_4_ = fVar112 * auVar14._4_4_ * 3.0;
    fStack_420 = fVar112 * auVar14._8_4_ * 3.0;
    fStack_41c = fVar112 * auVar14._12_4_ * 3.0;
    fStack_418 = fVar112 * auVar14._16_4_ * 3.0;
    fStack_414 = fVar112 * auVar14._20_4_ * 3.0;
    fStack_410 = fVar112 * auVar14._24_4_ * 3.0;
    fStack_40c = auVar14._28_4_;
    fVar67 = auVar276._0_4_;
    fVar142 = auVar276._4_4_;
    auVar21._4_4_ = fVar142 * fVar157;
    auVar21._0_4_ = fVar67 * fVar141;
    auVar21._8_4_ = fVar67 * fVar159;
    auVar21._12_4_ = fVar142 * fVar161;
    auVar21._16_4_ = fVar67 * 0.0;
    auVar21._20_4_ = fVar142 * 0.0;
    auVar21._24_4_ = fVar67 * 0.0;
    auVar21._28_4_ = auVar13._28_4_;
    auVar276 = vfmadd231ps_fma(auVar21,auVar85,auVar177);
    fVar67 = auVar10._0_4_;
    fVar179 = auVar10._4_4_;
    auVar22._4_4_ = fVar179 * fVar157;
    auVar22._0_4_ = fVar67 * fVar141;
    auVar22._8_4_ = fVar67 * fVar159;
    auVar22._12_4_ = fVar179 * fVar161;
    auVar22._16_4_ = fVar67 * 0.0;
    auVar22._20_4_ = fVar179 * 0.0;
    auVar22._24_4_ = fVar67 * 0.0;
    auVar22._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar22,auVar85,_local_408);
    fVar67 = auVar8._0_4_;
    fVar179 = auVar8._4_4_;
    auVar23._4_4_ = fVar179 * fVar157;
    auVar23._0_4_ = fVar67 * fVar141;
    auVar23._8_4_ = fVar67 * fVar159;
    auVar23._12_4_ = fVar179 * fVar161;
    auVar23._16_4_ = fVar67 * 0.0;
    auVar23._20_4_ = fVar179 * 0.0;
    auVar23._24_4_ = fVar67 * 0.0;
    auVar23._28_4_ = fVar112;
    auVar8 = vfmadd231ps_fma(auVar23,auVar85,auVar138);
    fVar67 = auVar9._0_4_;
    fVar162 = auVar9._4_4_;
    auVar24._4_4_ = fVar162 * fVar157;
    auVar24._0_4_ = fVar67 * fVar141;
    auVar24._8_4_ = fVar67 * fVar159;
    auVar24._12_4_ = fVar162 * fVar161;
    auVar24._16_4_ = fVar67 * 0.0;
    auVar24._20_4_ = fVar162 * 0.0;
    auVar24._24_4_ = fVar67 * 0.0;
    auVar24._28_4_ = fVar142;
    auVar9 = vfmadd231ps_fma(auVar24,auVar85,auVar155);
    local_2f8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar210));
    fVar67 = auVar87._0_4_;
    fVar142 = auVar87._4_4_;
    auVar25._4_4_ = fVar142 * fVar157;
    auVar25._0_4_ = fVar67 * fVar141;
    auVar25._8_4_ = fVar67 * fVar159;
    auVar25._12_4_ = fVar142 * fVar161;
    auVar25._16_4_ = fVar67 * 0.0;
    auVar25._20_4_ = fVar142 * 0.0;
    auVar25._24_4_ = fVar67 * 0.0;
    auVar25._28_4_ = local_2f8._28_4_;
    auVar10 = vfmadd231ps_fma(auVar25,auVar85,auVar258);
    _local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar113));
    auVar26._4_4_ = fVar157 * fStack_484;
    auVar26._0_4_ = fVar141 * local_488;
    auVar26._8_4_ = fVar159 * local_488;
    auVar26._12_4_ = fVar161 * fStack_484;
    auVar26._16_4_ = local_488 * 0.0;
    auVar26._20_4_ = fStack_484 * 0.0;
    auVar26._24_4_ = local_488 * 0.0;
    auVar26._28_4_ = fVar179;
    auVar87 = vfmadd231ps_fma(auVar26,auVar85,auVar278);
    auVar27._28_4_ = fVar142;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar161 * auVar8._12_4_,
                            CONCAT48(fVar159 * auVar8._8_4_,
                                     CONCAT44(fVar157 * auVar8._4_4_,fVar141 * auVar8._0_4_))));
    auVar276 = vfmadd231ps_fma(auVar27,auVar85,ZEXT1632(auVar276));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar9._12_4_,
                                                 CONCAT48(fVar159 * auVar9._8_4_,
                                                          CONCAT44(fVar157 * auVar9._4_4_,
                                                                   fVar141 * auVar9._0_4_)))),
                              auVar85,ZEXT1632(auVar12));
    fVar156 = auVar210._0_4_ + fVar156;
    fVar160 = auVar210._4_4_ + fVar160;
    fVar260 = auVar210._8_4_ + fVar260;
    fVar262 = auVar210._12_4_ + fVar262;
    fStack_478 = fStack_478 + 0.0;
    fStack_474 = fStack_474 + 0.0;
    fStack_470 = fStack_470 + 0.0;
    uStack_46c = 0x40400000;
    auVar28._28_4_ = 0x40400000;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar87._12_4_ * fVar161,
                            CONCAT48(auVar87._8_4_ * fVar159,
                                     CONCAT44(auVar87._4_4_ * fVar157,auVar87._0_4_ * fVar141))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar10._12_4_,
                                                CONCAT48(fVar159 * auVar10._8_4_,
                                                         CONCAT44(fVar157 * auVar10._4_4_,
                                                                  fVar141 * auVar10._0_4_)))),
                             auVar85,ZEXT1632(auVar8));
    auVar9 = vfmadd231ps_fma(auVar28,auVar85,ZEXT1632(auVar9));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar8._12_4_,
                                                 CONCAT48(fVar159 * auVar8._8_4_,
                                                          CONCAT44(fVar157 * auVar8._4_4_,
                                                                   fVar141 * auVar8._0_4_)))),
                              auVar85,ZEXT1632(auVar276));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar9._12_4_,
                                                 CONCAT48(fVar159 * auVar9._8_4_,
                                                          CONCAT44(fVar157 * auVar9._4_4_,
                                                                   fVar141 * auVar9._0_4_)))),
                              ZEXT1632(auVar12),auVar85);
    auVar85 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar276));
    auVar13 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
    fVar141 = fVar112 * auVar85._0_4_ * 3.0;
    fVar157 = fVar112 * auVar85._4_4_ * 3.0;
    auVar29._4_4_ = fVar157;
    auVar29._0_4_ = fVar141;
    fVar159 = fVar112 * auVar85._8_4_ * 3.0;
    auVar29._8_4_ = fVar159;
    fVar161 = fVar112 * auVar85._12_4_ * 3.0;
    auVar29._12_4_ = fVar161;
    fVar162 = fVar112 * auVar85._16_4_ * 3.0;
    auVar29._16_4_ = fVar162;
    fVar163 = fVar112 * auVar85._20_4_ * 3.0;
    auVar29._20_4_ = fVar163;
    fVar140 = fVar112 * auVar85._24_4_ * 3.0;
    auVar29._24_4_ = fVar140;
    auVar29._28_4_ = 0x40400000;
    auVar200._0_4_ = fVar112 * auVar13._0_4_ * 3.0;
    auVar200._4_4_ = fVar112 * auVar13._4_4_ * 3.0;
    auVar200._8_4_ = fVar112 * auVar13._8_4_ * 3.0;
    auVar200._12_4_ = fVar112 * auVar13._12_4_ * 3.0;
    auVar200._16_4_ = fVar112 * auVar13._16_4_ * 3.0;
    auVar200._20_4_ = fVar112 * auVar13._20_4_ * 3.0;
    auVar200._24_4_ = fVar112 * auVar13._24_4_ * 3.0;
    auVar200._28_4_ = 0;
    local_468 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar10));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar87));
    auVar85 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar210));
    auVar13 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar113));
    auVar15 = vsubps_avx(local_468,local_2f8);
    fVar158 = auVar85._0_4_ + auVar15._0_4_;
    fVar250 = auVar85._4_4_ + auVar15._4_4_;
    fVar261 = auVar85._8_4_ + auVar15._8_4_;
    fVar180 = auVar85._12_4_ + auVar15._12_4_;
    fVar181 = auVar85._16_4_ + auVar15._16_4_;
    fVar182 = auVar85._20_4_ + auVar15._20_4_;
    fVar183 = auVar85._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,_local_408);
    auVar272._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar272._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar272._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar272._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar272._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar272._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar272._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar272._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar112 = auVar113._0_4_;
    local_158 = fVar112 + (float)local_428._0_4_;
    fVar67 = auVar113._4_4_;
    fStack_154 = fVar67 + (float)local_428._4_4_;
    fVar142 = auVar113._8_4_;
    fStack_150 = fVar142 + fStack_420;
    fVar179 = auVar113._12_4_;
    fStack_14c = fVar179 + fStack_41c;
    fStack_148 = fStack_418 + 0.0;
    fStack_144 = fStack_414 + 0.0;
    fStack_140 = fStack_410 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar210);
    auVar13 = vsubps_avx(local_98,auVar20);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar113);
    auVar13 = vsubps_avx(local_b8,_local_428);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar10._0_4_ + fVar141;
    local_f8._4_4_ = auVar10._4_4_ + fVar157;
    local_f8._8_4_ = auVar10._8_4_ + fVar159;
    local_f8._12_4_ = auVar10._12_4_ + fVar161;
    local_f8._16_4_ = fVar162 + 0.0;
    local_f8._20_4_ = fVar163 + 0.0;
    local_f8._24_4_ = fVar140 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar259 = ZEXT1632(auVar10);
    auVar13 = vsubps_avx(auVar259,auVar29);
    _local_428 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar141 = auVar87._0_4_;
    local_138._0_4_ = fVar141 + auVar200._0_4_;
    fVar157 = auVar87._4_4_;
    local_138._4_4_ = fVar157 + auVar200._4_4_;
    fVar159 = auVar87._8_4_;
    local_138._8_4_ = fVar159 + auVar200._8_4_;
    fVar161 = auVar87._12_4_;
    local_138._12_4_ = fVar161 + auVar200._12_4_;
    local_138._16_4_ = auVar200._16_4_ + 0.0;
    local_138._20_4_ = auVar200._20_4_ + 0.0;
    local_138._24_4_ = auVar200._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar87),auVar200);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar30._4_4_ = fVar67 * fVar250;
    auVar30._0_4_ = fVar112 * fVar158;
    auVar30._8_4_ = fVar142 * fVar261;
    auVar30._12_4_ = fVar179 * fVar180;
    auVar30._16_4_ = fVar181 * 0.0;
    auVar30._20_4_ = fVar182 * 0.0;
    auVar30._24_4_ = fVar183 * 0.0;
    auVar30._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar30,local_98,auVar272);
    auVar31._4_4_ = fStack_154 * fVar250;
    auVar31._0_4_ = local_158 * fVar158;
    auVar31._8_4_ = fStack_150 * fVar261;
    auVar31._12_4_ = fStack_14c * fVar180;
    auVar31._16_4_ = fStack_148 * fVar181;
    auVar31._20_4_ = fStack_144 * fVar182;
    auVar31._24_4_ = fStack_140 * fVar183;
    auVar31._28_4_ = local_428._28_4_;
    auVar44._4_4_ = fVar160;
    auVar44._0_4_ = fVar156;
    auVar44._8_4_ = fVar260;
    auVar44._12_4_ = fVar262;
    auVar44._16_4_ = fStack_478;
    auVar44._20_4_ = fStack_474;
    auVar44._24_4_ = fStack_470;
    auVar44._28_4_ = 0x40400000;
    auVar8 = vfnmadd231ps_fma(auVar31,auVar272,auVar44);
    auVar32._4_4_ = local_178._4_4_ * fVar250;
    auVar32._0_4_ = local_178._0_4_ * fVar158;
    auVar32._8_4_ = local_178._8_4_ * fVar261;
    auVar32._12_4_ = local_178._12_4_ * fVar180;
    auVar32._16_4_ = local_178._16_4_ * fVar181;
    auVar32._20_4_ = local_178._20_4_ * fVar182;
    auVar32._24_4_ = local_178._24_4_ * fVar183;
    auVar32._28_4_ = fStack_13c;
    auVar276 = vfnmadd231ps_fma(auVar32,local_d8,auVar272);
    auVar33._4_4_ = fVar250 * (float)local_408._4_4_;
    auVar33._0_4_ = fVar158 * (float)local_408._0_4_;
    auVar33._8_4_ = fVar261 * (float)uStack_400;
    auVar33._12_4_ = fVar180 * uStack_400._4_4_;
    auVar33._16_4_ = fVar181 * (float)uStack_3f8;
    auVar33._20_4_ = fVar182 * uStack_3f8._4_4_;
    auVar33._24_4_ = fVar183 * (float)uStack_3f0;
    auVar33._28_4_ = local_178._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar33,local_2f8,auVar272);
    auVar51._4_4_ = fVar157 * fVar250;
    auVar51._0_4_ = fVar141 * fVar158;
    auVar51._8_4_ = fVar159 * fVar261;
    auVar51._12_4_ = fVar161 * fVar180;
    auVar51._16_4_ = fVar181 * 0.0;
    auVar51._20_4_ = fVar182 * 0.0;
    auVar51._24_4_ = fVar183 * 0.0;
    auVar51._28_4_ = DAT_0205d4a0._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar51,auVar259,auVar272);
    auVar34._4_4_ = local_138._4_4_ * fVar250;
    auVar34._0_4_ = local_138._0_4_ * fVar158;
    auVar34._8_4_ = local_138._8_4_ * fVar261;
    auVar34._12_4_ = local_138._12_4_ * fVar180;
    auVar34._16_4_ = local_138._16_4_ * fVar181;
    auVar34._20_4_ = local_138._20_4_ * fVar182;
    auVar34._24_4_ = local_138._24_4_ * fVar183;
    auVar34._28_4_ = local_2f8._28_4_;
    auVar69 = vfnmadd231ps_fma(auVar34,local_f8,auVar272);
    auVar35._4_4_ = local_118._4_4_ * fVar250;
    auVar35._0_4_ = local_118._0_4_ * fVar158;
    auVar35._8_4_ = local_118._8_4_ * fVar261;
    auVar35._12_4_ = local_118._12_4_ * fVar180;
    auVar35._16_4_ = local_118._16_4_ * fVar181;
    auVar35._20_4_ = local_118._20_4_ * fVar182;
    auVar35._24_4_ = local_118._24_4_ * fVar183;
    auVar35._28_4_ = local_d8._28_4_;
    auVar210 = vfnmadd231ps_fma(auVar35,auVar272,_local_428);
    auVar36._4_4_ = local_78._4_4_ * fVar250;
    auVar36._0_4_ = local_78._0_4_ * fVar158;
    auVar36._8_4_ = local_78._8_4_ * fVar261;
    auVar36._12_4_ = local_78._12_4_ * fVar180;
    auVar36._16_4_ = local_78._16_4_ * fVar181;
    auVar36._20_4_ = local_78._20_4_ * fVar182;
    auVar36._24_4_ = local_78._24_4_ * fVar183;
    auVar36._28_4_ = auVar85._28_4_ + auVar15._28_4_;
    auVar113 = vfnmadd231ps_fma(auVar36,auVar272,local_468);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar85 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar276),ZEXT1632(auVar9));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar276),ZEXT1632(auVar9));
    auVar85 = vmaxps_avx(auVar85,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar69));
    auVar13 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar69));
    auVar16 = vminps_avx(ZEXT1632(auVar210),ZEXT1632(auVar113));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar210),ZEXT1632(auVar113));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar85,auVar13);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar85 = vcmpps_avx(auVar15,auVar50,2);
    auVar49._4_4_ = uStack_1b4;
    auVar49._0_4_ = local_1b8;
    auVar49._8_4_ = uStack_1b0;
    auVar49._12_4_ = uStack_1ac;
    auVar49._16_4_ = uStack_1a8;
    auVar49._20_4_ = uStack_1a4;
    auVar49._24_4_ = uStack_1a0;
    auVar49._28_4_ = uStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar49,5);
    auVar85 = vandps_avx(auVar13,auVar85);
    auVar13 = local_1f8 & auVar85;
    uVar55 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_2f8,local_98);
      auVar14 = vsubps_avx(local_468,auVar259);
      fVar163 = auVar13._0_4_ + auVar14._0_4_;
      fVar140 = auVar13._4_4_ + auVar14._4_4_;
      fVar158 = auVar13._8_4_ + auVar14._8_4_;
      fVar250 = auVar13._12_4_ + auVar14._12_4_;
      fVar261 = auVar13._16_4_ + auVar14._16_4_;
      fVar180 = auVar13._20_4_ + auVar14._20_4_;
      fVar181 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_408,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar87));
      auVar98._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar98._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar98._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar98._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar98._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar98._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar98._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar162 = auVar16._28_4_;
      auVar98._28_4_ = auVar15._28_4_ + fVar162;
      auVar279._0_4_ = fVar112 * fVar163;
      auVar279._4_4_ = fVar67 * fVar140;
      auVar279._8_4_ = fVar142 * fVar158;
      auVar279._12_4_ = fVar179 * fVar250;
      auVar279._16_4_ = fVar261 * 0.0;
      auVar279._20_4_ = fVar180 * 0.0;
      auVar279._24_4_ = fVar181 * 0.0;
      auVar279._28_4_ = 0;
      auVar10 = vfnmadd231ps_fma(auVar279,auVar98,local_98);
      auVar37._4_4_ = fVar140 * fStack_154;
      auVar37._0_4_ = fVar163 * local_158;
      auVar37._8_4_ = fVar158 * fStack_150;
      auVar37._12_4_ = fVar250 * fStack_14c;
      auVar37._16_4_ = fVar261 * fStack_148;
      auVar37._20_4_ = fVar180 * fStack_144;
      auVar37._24_4_ = fVar181 * fStack_140;
      auVar37._28_4_ = fVar162;
      auVar45._4_4_ = fVar160;
      auVar45._0_4_ = fVar156;
      auVar45._8_4_ = fVar260;
      auVar45._12_4_ = fVar262;
      auVar45._16_4_ = fStack_478;
      auVar45._20_4_ = fStack_474;
      auVar45._24_4_ = fStack_470;
      auVar45._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar45,auVar98,auVar37);
      auVar38._4_4_ = fVar140 * local_178._4_4_;
      auVar38._0_4_ = fVar163 * local_178._0_4_;
      auVar38._8_4_ = fVar158 * local_178._8_4_;
      auVar38._12_4_ = fVar250 * local_178._12_4_;
      auVar38._16_4_ = fVar261 * local_178._16_4_;
      auVar38._20_4_ = fVar180 * local_178._20_4_;
      auVar38._24_4_ = fVar181 * local_178._24_4_;
      auVar38._28_4_ = fVar162;
      auVar8 = vfnmadd213ps_fma(local_d8,auVar98,auVar38);
      auVar39._4_4_ = (float)local_408._4_4_ * fVar140;
      auVar39._0_4_ = (float)local_408._0_4_ * fVar163;
      auVar39._8_4_ = (float)uStack_400 * fVar158;
      auVar39._12_4_ = uStack_400._4_4_ * fVar250;
      auVar39._16_4_ = (float)uStack_3f8 * fVar261;
      auVar39._20_4_ = uStack_3f8._4_4_ * fVar180;
      auVar39._24_4_ = (float)uStack_3f0 * fVar181;
      auVar39._28_4_ = fVar162;
      auVar87 = vfnmadd231ps_fma(auVar39,auVar98,local_2f8);
      auVar110._0_4_ = fVar141 * fVar163;
      auVar110._4_4_ = fVar157 * fVar140;
      auVar110._8_4_ = fVar159 * fVar158;
      auVar110._12_4_ = fVar161 * fVar250;
      auVar110._16_4_ = fVar261 * 0.0;
      auVar110._20_4_ = fVar180 * 0.0;
      auVar110._24_4_ = fVar181 * 0.0;
      auVar110._28_4_ = 0;
      auVar69 = vfnmadd231ps_fma(auVar110,auVar98,auVar259);
      auVar40._4_4_ = fVar140 * local_138._4_4_;
      auVar40._0_4_ = fVar163 * local_138._0_4_;
      auVar40._8_4_ = fVar158 * local_138._8_4_;
      auVar40._12_4_ = fVar250 * local_138._12_4_;
      auVar40._16_4_ = fVar261 * local_138._16_4_;
      auVar40._20_4_ = fVar180 * local_138._20_4_;
      auVar40._24_4_ = fVar181 * local_138._24_4_;
      auVar40._28_4_ = local_408._28_4_;
      auVar276 = vfnmadd213ps_fma(local_f8,auVar98,auVar40);
      auVar41._4_4_ = fVar140 * local_118._4_4_;
      auVar41._0_4_ = fVar163 * local_118._0_4_;
      auVar41._8_4_ = fVar158 * local_118._8_4_;
      auVar41._12_4_ = fVar250 * local_118._12_4_;
      auVar41._16_4_ = fVar261 * local_118._16_4_;
      auVar41._20_4_ = fVar180 * local_118._20_4_;
      auVar41._24_4_ = fVar181 * local_118._24_4_;
      auVar41._28_4_ = local_408._28_4_;
      auVar9 = vfnmadd213ps_fma(_local_428,auVar98,auVar41);
      auVar42._4_4_ = local_78._4_4_ * fVar140;
      auVar42._0_4_ = local_78._0_4_ * fVar163;
      auVar42._8_4_ = local_78._8_4_ * fVar158;
      auVar42._12_4_ = local_78._12_4_ * fVar250;
      auVar42._16_4_ = local_78._16_4_ * fVar261;
      auVar42._20_4_ = local_78._20_4_ * fVar180;
      auVar42._24_4_ = local_78._24_4_ * fVar181;
      auVar42._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar210 = vfnmadd231ps_fma(auVar42,auVar98,local_468);
      auVar14 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar87));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar87));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar69),ZEXT1632(auVar276));
      auVar14 = vmaxps_avx(ZEXT1632(auVar69),ZEXT1632(auVar276));
      auVar259 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar210));
      auVar16 = vminps_avx(auVar16,auVar259);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar210));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar50,2);
      auVar14 = vcmpps_avx(auVar14,auVar49,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar85 = vandps_avx(auVar85,local_1f8);
      auVar14 = auVar85 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar85 = vandps_avx(auVar13,auVar85);
        uVar55 = vmovmskps_avx(auVar85);
      }
    }
    if (uVar55 != 0) {
      auStack_2d8[uVar57] = uVar55;
      uVar164 = vmovlps_avx(local_248);
      *(undefined8 *)(&uStack_1d8 + uVar57 * 2) = uVar164;
      uVar62 = vmovlps_avx(local_4c8);
      auStack_58[uVar57] = uVar62;
      uVar57 = (ulong)((int)uVar57 + 1);
    }
    do {
      if ((int)uVar57 == 0) {
        if (bVar52) {
          return bVar64;
        }
        fVar141 = ray->tfar;
        auVar84._4_4_ = fVar141;
        auVar84._0_4_ = fVar141;
        auVar84._8_4_ = fVar141;
        auVar84._12_4_ = fVar141;
        auVar12 = vcmpps_avx(local_258,auVar84,2);
        uVar54 = vmovmskps_avx(auVar12);
        uVar54 = SUB84(auVar63,0) & (uint)local_438 & uVar54;
        bVar64 = uVar54 != 0;
        if (!bVar64) {
          return bVar64;
        }
        goto LAB_016a7b99;
      }
      uVar56 = (int)uVar57 - 1;
      uVar58 = (ulong)uVar56;
      uVar61 = auStack_2d8[uVar58];
      uVar55 = (&uStack_1d8)[uVar58 * 2];
      fVar141 = afStack_1d4[uVar58 * 2];
      iVar17 = 0;
      for (uVar62 = (ulong)uVar61; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        iVar17 = iVar17 + 1;
      }
      uVar61 = uVar61 - 1 & uVar61;
      if (uVar61 == 0) {
        uVar57 = (ulong)uVar56;
      }
      local_4c8._8_8_ = 0;
      local_4c8._0_8_ = auStack_58[uVar58];
      auStack_2d8[uVar58] = uVar61;
      fVar157 = (float)(iVar17 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * (float)iVar17 * 0.14285715)),
                                ZEXT416(uVar55),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar157)),ZEXT416(uVar55),
                               ZEXT416((uint)(1.0 - fVar157)));
      auVar280 = ZEXT1664(auVar8);
      fVar157 = auVar12._0_4_;
      local_488 = auVar8._0_4_;
      fVar141 = local_488 - fVar157;
      local_468._0_16_ = auVar12;
      fStack_484 = auVar8._4_4_;
      uStack_480 = auVar8._8_4_;
      uStack_47c = auVar8._12_4_;
      if (0.16666667 <= fVar141) break;
      auVar276 = vshufps_avx(local_4c8,local_4c8,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar9 = vsubps_avx(auVar101,auVar276);
      fVar159 = auVar276._0_4_;
      auVar116._0_4_ = fVar65 * fVar159;
      fVar161 = auVar276._4_4_;
      auVar116._4_4_ = fVar86 * fVar161;
      fVar112 = auVar276._8_4_;
      auVar116._8_4_ = fVar65 * fVar112;
      fVar67 = auVar276._12_4_;
      auVar116._12_4_ = fVar86 * fVar67;
      auVar128._0_4_ = fVar263 * fVar159;
      auVar128._4_4_ = fVar273 * fVar161;
      auVar128._8_4_ = fVar263 * fVar112;
      auVar128._12_4_ = fVar273 * fVar67;
      auVar149._0_4_ = fVar184 * fVar159;
      auVar149._4_4_ = fVar201 * fVar161;
      auVar149._8_4_ = fVar184 * fVar112;
      auVar149._12_4_ = fVar201 * fVar67;
      auVar90._0_4_ = fVar219 * fVar159;
      auVar90._4_4_ = fVar231 * fVar161;
      auVar90._8_4_ = fVar219 * fVar112;
      auVar90._12_4_ = fVar231 * fVar67;
      auVar276 = vfmadd231ps_fma(auVar116,auVar9,auVar282);
      auVar10 = vfmadd231ps_fma(auVar128,auVar9,auVar207);
      auVar87 = vfmadd231ps_fma(auVar149,auVar9,auVar89);
      auVar9 = vfmadd231ps_fma(auVar90,auVar100,auVar9);
      auVar111._16_16_ = auVar276;
      auVar111._0_16_ = auVar276;
      auVar123._16_16_ = auVar10;
      auVar123._0_16_ = auVar10;
      auVar139._16_16_ = auVar87;
      auVar139._0_16_ = auVar87;
      auVar178._4_4_ = fVar157;
      auVar178._0_4_ = fVar157;
      auVar178._8_4_ = fVar157;
      auVar178._12_4_ = fVar157;
      auVar178._20_4_ = local_488;
      auVar178._16_4_ = local_488;
      auVar178._24_4_ = local_488;
      auVar178._28_4_ = local_488;
      auVar85 = vsubps_avx(auVar123,auVar111);
      auVar10 = vfmadd213ps_fma(auVar85,auVar178,auVar111);
      auVar85 = vsubps_avx(auVar139,auVar123);
      auVar69 = vfmadd213ps_fma(auVar85,auVar178,auVar123);
      auVar276 = vsubps_avx(auVar9,auVar87);
      auVar124._16_16_ = auVar276;
      auVar124._0_16_ = auVar276;
      auVar276 = vfmadd213ps_fma(auVar124,auVar178,auVar139);
      auVar85 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar10));
      auVar9 = vfmadd213ps_fma(auVar85,auVar178,ZEXT1632(auVar10));
      auVar85 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar69));
      auVar276 = vfmadd213ps_fma(auVar85,auVar178,ZEXT1632(auVar69));
      auVar85 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar9));
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar85,auVar178);
      fVar179 = auVar85._4_4_ * 3.0;
      fVar142 = fVar141 * 0.33333334;
      auVar234._0_8_ =
           CONCAT44(auVar126._4_4_ + fVar142 * fVar179,
                    auVar126._0_4_ + fVar142 * auVar85._0_4_ * 3.0);
      auVar234._8_4_ = auVar126._8_4_ + fVar142 * auVar85._8_4_ * 3.0;
      auVar234._12_4_ = auVar126._12_4_ + fVar142 * auVar85._12_4_ * 3.0;
      auVar9 = vshufpd_avx(auVar126,auVar126,3);
      auVar10 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_428 = auVar9;
      auVar13 = _local_428;
      auVar276 = vsubps_avx(auVar9,auVar126);
      _local_408 = auVar10;
      auVar87 = vsubps_avx(auVar10,(undefined1  [16])0x0);
      auVar102._0_4_ = auVar276._0_4_ + auVar87._0_4_;
      auVar102._4_4_ = auVar276._4_4_ + auVar87._4_4_;
      auVar102._8_4_ = auVar276._8_4_ + auVar87._8_4_;
      auVar102._12_4_ = auVar276._12_4_ + auVar87._12_4_;
      auVar276 = vshufps_avx(auVar126,auVar126,0xb1);
      auVar87 = vshufps_avx(auVar234,auVar234,0xb1);
      auVar265._4_4_ = auVar102._0_4_;
      auVar265._0_4_ = auVar102._0_4_;
      auVar265._8_4_ = auVar102._0_4_;
      auVar265._12_4_ = auVar102._0_4_;
      auVar69 = vshufps_avx(auVar102,auVar102,0x55);
      fVar159 = auVar69._0_4_;
      auVar190._0_4_ = auVar276._0_4_ * fVar159;
      fVar161 = auVar69._4_4_;
      auVar190._4_4_ = auVar276._4_4_ * fVar161;
      fVar112 = auVar69._8_4_;
      auVar190._8_4_ = auVar276._8_4_ * fVar112;
      fVar67 = auVar69._12_4_;
      auVar190._12_4_ = auVar276._12_4_ * fVar67;
      auVar208._0_4_ = auVar87._0_4_ * fVar159;
      auVar208._4_4_ = auVar87._4_4_ * fVar161;
      auVar208._8_4_ = auVar87._8_4_ * fVar112;
      auVar208._12_4_ = auVar87._12_4_ * fVar67;
      auVar210 = vfmadd231ps_fma(auVar190,auVar265,auVar126);
      local_2f8._0_16_ = auVar234;
      auVar113 = vfmadd231ps_fma(auVar208,auVar265,auVar234);
      auVar87 = vshufps_avx(auVar210,auVar210,0xe8);
      auVar69 = vshufps_avx(auVar113,auVar113,0xe8);
      auVar276 = vcmpps_avx(auVar87,auVar69,1);
      uVar55 = vextractps_avx(auVar276,0);
      auVar68 = auVar113;
      if ((uVar55 & 1) == 0) {
        auVar68 = auVar210;
      }
      auVar129._0_4_ = fVar142 * auVar85._16_4_ * 3.0;
      auVar129._4_4_ = fVar142 * fVar179;
      auVar129._8_4_ = fVar142 * auVar85._24_4_ * 3.0;
      auVar129._12_4_ = fVar142 * local_488;
      auVar144 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar130 = vshufps_avx(auVar144,auVar144,0xb1);
      auVar125 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar283._0_4_ = auVar130._0_4_ * fVar159;
      auVar283._4_4_ = auVar130._4_4_ * fVar161;
      auVar283._8_4_ = auVar130._8_4_ * fVar112;
      auVar283._12_4_ = auVar130._12_4_ * fVar67;
      auVar103._0_4_ = auVar125._0_4_ * fVar159;
      auVar103._4_4_ = auVar125._4_4_ * fVar161;
      auVar103._8_4_ = auVar125._8_4_ * fVar112;
      auVar103._12_4_ = auVar125._12_4_ * fVar67;
      auVar145 = vfmadd231ps_fma(auVar283,auVar265,auVar144);
      auVar185 = vfmadd231ps_fma(auVar103,(undefined1  [16])0x0,auVar265);
      auVar125 = vshufps_avx(auVar145,auVar145,0xe8);
      auVar143 = vshufps_avx(auVar185,auVar185,0xe8);
      auVar130 = vcmpps_avx(auVar125,auVar143,1);
      uVar55 = vextractps_avx(auVar130,0);
      auVar202 = auVar185;
      if ((uVar55 & 1) == 0) {
        auVar202 = auVar145;
      }
      auVar68 = vmaxss_avx(auVar202,auVar68);
      auVar87 = vminps_avx(auVar87,auVar69);
      auVar69 = vminps_avx(auVar125,auVar143);
      auVar69 = vminps_avx(auVar87,auVar69);
      auVar276 = vshufps_avx(auVar276,auVar276,0x55);
      auVar276 = vblendps_avx(auVar276,auVar130,2);
      auVar130 = vpslld_avx(auVar276,0x1f);
      auVar276 = vshufpd_avx(auVar113,auVar113,1);
      auVar276 = vinsertps_avx(auVar276,auVar185,0x9c);
      auVar87 = vshufpd_avx(auVar210,auVar210,1);
      auVar87 = vinsertps_avx(auVar87,auVar145,0x9c);
      auVar276 = vblendvps_avx(auVar87,auVar276,auVar130);
      auVar87 = vmovshdup_avx(auVar276);
      auVar276 = vmaxss_avx(auVar87,auVar276);
      fVar112 = auVar69._0_4_;
      auVar87 = vmovshdup_avx(auVar69);
      fVar161 = auVar276._0_4_;
      fVar159 = auVar68._0_4_;
      _local_428 = auVar13;
      if ((0.0001 <= fVar112) || (fVar161 <= -0.0001)) {
        auVar210 = vcmpps_avx(auVar87,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar113 = vcmpps_avx(auVar69,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar210 = vorps_avx(auVar113,auVar210);
        if ((-0.0001 < fVar159 & auVar210[0]) != 0) goto LAB_016a8bc3;
        auVar210 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar276,5);
        auVar113 = vcmpps_avx(auVar87,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar210 = vorps_avx(auVar113,auVar210);
        if ((auVar210 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016a8bc3;
LAB_016a984e:
        bVar43 = true;
      }
      else {
LAB_016a8bc3:
        auVar113 = vcmpps_avx(auVar69,_DAT_01feba10,1);
        auVar130 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar210 = vcmpss_avx(auVar68,ZEXT816(0) << 0x20,1);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = &DAT_3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar209._8_4_ = 0xbf800000;
        auVar209._0_8_ = 0xbf800000bf800000;
        auVar209._12_4_ = 0xbf800000;
        auVar210 = vblendvps_avx(auVar150,auVar209,auVar210);
        auVar113 = vblendvps_avx(auVar150,auVar209,auVar113);
        fVar67 = auVar113._0_4_;
        fVar142 = auVar210._0_4_;
        auVar210 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar125 = ZEXT816(0) << 0x20;
        if ((fVar67 == fVar142) && (!NAN(fVar67) && !NAN(fVar142))) {
          auVar210 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar67 == fVar142) && (!NAN(fVar67) && !NAN(fVar142))) {
          auVar130 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar113 = vmovshdup_avx(auVar113);
        fVar179 = auVar113._0_4_;
        if ((fVar67 != fVar179) || (NAN(fVar67) || NAN(fVar179))) {
          fVar67 = auVar87._0_4_;
          if ((fVar67 != fVar112) || (NAN(fVar67) || NAN(fVar112))) {
            auVar104._0_4_ = (float)((uint)fVar112 ^ local_368);
            auVar104._4_4_ = auVar69._4_4_ ^ uStack_364;
            auVar104._8_4_ = auVar69._8_4_ ^ uStack_360;
            auVar104._12_4_ = auVar69._12_4_ ^ uStack_35c;
            auVar131._0_4_ = auVar104._0_4_ / (fVar67 - fVar112);
            auVar131._4_12_ = auVar104._4_12_;
            auVar87 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar125,auVar131);
            auVar69 = auVar87;
          }
          else {
            auVar87 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar112 == 0.0) && (auVar87 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar112))) {
              auVar87 = ZEXT816(0);
            }
            auVar69 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar112 == 0.0) && (auVar69 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar112))) {
              auVar69 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar210 = vminss_avx(auVar210,auVar87);
          auVar130 = vmaxss_avx(auVar69,auVar130);
        }
        auVar276 = vcmpss_avx(auVar276,auVar125,1);
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = &DAT_3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar151._8_4_ = 0xbf800000;
        auVar151._0_8_ = 0xbf800000bf800000;
        auVar151._12_4_ = 0xbf800000;
        auVar276 = vblendvps_avx(auVar132,auVar151,auVar276);
        fVar112 = auVar276._0_4_;
        auVar276 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar142 != fVar112) || (NAN(fVar142) || NAN(fVar112))) {
          if ((fVar161 != fVar159) || (NAN(fVar161) || NAN(fVar159))) {
            auVar105._0_4_ = (float)((uint)fVar159 ^ local_368);
            auVar105._4_4_ = auVar68._4_4_ ^ uStack_364;
            auVar105._8_4_ = auVar68._8_4_ ^ uStack_360;
            auVar105._12_4_ = auVar68._12_4_ ^ uStack_35c;
            auVar133._0_4_ = auVar105._0_4_ / (fVar161 - fVar159);
            auVar133._4_12_ = auVar105._4_12_;
            auVar87 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar125,auVar133);
            auVar69 = auVar87;
          }
          else {
            auVar87 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar159 == 0.0) && (auVar87 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar159))) {
              auVar87 = ZEXT816(0);
            }
            auVar69 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar159 == 0.0) && (auVar69 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar159))) {
              auVar69 = auVar276;
            }
          }
          auVar210 = vminss_avx(auVar210,auVar87);
          auVar130 = vmaxss_avx(auVar69,auVar130);
        }
        if ((fVar179 != fVar112) || (NAN(fVar179) || NAN(fVar112))) {
          auVar210 = vminss_avx(auVar210,auVar276);
          auVar130 = vmaxss_avx(auVar276,auVar130);
        }
        auVar87 = vmaxss_avx(auVar125,auVar210);
        auVar69 = vminss_avx(auVar130,auVar276);
        bVar43 = true;
        if (auVar87._0_4_ <= auVar69._0_4_) {
          auVar87 = vmaxss_avx(auVar125,ZEXT416((uint)(auVar87._0_4_ + -0.1)));
          auVar276 = vminss_avx(ZEXT416((uint)(auVar69._0_4_ + 0.1)),auVar276);
          auVar91._0_8_ = auVar126._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar211._8_8_ = auVar234._0_8_;
          auVar211._0_8_ = auVar234._0_8_;
          auVar226._8_8_ = auVar144._0_8_;
          auVar226._0_8_ = auVar144._0_8_;
          auVar69 = vshufpd_avx(auVar234,auVar234,3);
          auVar210 = vshufpd_avx(auVar144,auVar144,3);
          auVar113 = vshufps_avx(auVar87,auVar276,0);
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = &DAT_3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          auVar126 = vsubps_avx(auVar117,auVar113);
          local_428._0_4_ = auVar9._0_4_;
          local_428._4_4_ = auVar9._4_4_;
          fStack_420 = auVar9._8_4_;
          fStack_41c = auVar9._12_4_;
          fVar159 = auVar113._0_4_;
          auVar118._0_4_ = fVar159 * (float)local_428._0_4_;
          fVar161 = auVar113._4_4_;
          auVar118._4_4_ = fVar161 * (float)local_428._4_4_;
          fVar112 = auVar113._8_4_;
          auVar118._8_4_ = fVar112 * fStack_420;
          fVar67 = auVar113._12_4_;
          auVar118._12_4_ = fVar67 * fStack_41c;
          auVar134._0_4_ = auVar69._0_4_ * fVar159;
          auVar134._4_4_ = auVar69._4_4_ * fVar161;
          auVar134._8_4_ = auVar69._8_4_ * fVar112;
          auVar134._12_4_ = auVar69._12_4_ * fVar67;
          auVar152._0_4_ = auVar210._0_4_ * fVar159;
          auVar152._4_4_ = auVar210._4_4_ * fVar161;
          auVar152._8_4_ = auVar210._8_4_ * fVar112;
          auVar152._12_4_ = auVar210._12_4_ * fVar67;
          local_408._0_4_ = auVar10._0_4_;
          local_408._4_4_ = auVar10._4_4_;
          uStack_400._0_4_ = auVar10._8_4_;
          uStack_400._4_4_ = auVar10._12_4_;
          auVar173._0_4_ = fVar159 * (float)local_408._0_4_;
          auVar173._4_4_ = fVar161 * (float)local_408._4_4_;
          auVar173._8_4_ = fVar112 * (float)uStack_400;
          auVar173._12_4_ = fVar67 * uStack_400._4_4_;
          auVar69 = vfmadd231ps_fma(auVar118,auVar126,auVar91);
          auVar210 = vfmadd231ps_fma(auVar134,auVar126,auVar211);
          auVar113 = vfmadd231ps_fma(auVar152,auVar126,auVar226);
          auVar126 = vfmadd231ps_fma(auVar173,auVar126,ZEXT816(0));
          auVar9 = vmovshdup_avx(local_4c8);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar87._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar87._0_4_)));
          auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar276._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar276._0_4_)));
          fVar159 = 1.0 / fVar141;
          auVar276 = vsubps_avx(auVar210,auVar69);
          auVar191._0_4_ = auVar276._0_4_ * 3.0;
          auVar191._4_4_ = auVar276._4_4_ * 3.0;
          auVar191._8_4_ = auVar276._8_4_ * 3.0;
          auVar191._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar113,auVar210);
          auVar212._0_4_ = auVar276._0_4_ * 3.0;
          auVar212._4_4_ = auVar276._4_4_ * 3.0;
          auVar212._8_4_ = auVar276._8_4_ * 3.0;
          auVar212._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar126,auVar113);
          auVar227._0_4_ = auVar276._0_4_ * 3.0;
          auVar227._4_4_ = auVar276._4_4_ * 3.0;
          auVar227._8_4_ = auVar276._8_4_ * 3.0;
          auVar227._12_4_ = auVar276._12_4_ * 3.0;
          auVar9 = vminps_avx(auVar212,auVar227);
          auVar276 = vmaxps_avx(auVar212,auVar227);
          auVar9 = vminps_avx(auVar191,auVar9);
          auVar276 = vmaxps_avx(auVar191,auVar276);
          auVar10 = vshufpd_avx(auVar9,auVar9,3);
          auVar87 = vshufpd_avx(auVar276,auVar276,3);
          auVar9 = vminps_avx(auVar9,auVar10);
          auVar276 = vmaxps_avx(auVar276,auVar87);
          auVar213._0_4_ = auVar9._0_4_ * fVar159;
          auVar213._4_4_ = auVar9._4_4_ * fVar159;
          auVar213._8_4_ = auVar9._8_4_ * fVar159;
          auVar213._12_4_ = auVar9._12_4_ * fVar159;
          auVar192._0_4_ = fVar159 * auVar276._0_4_;
          auVar192._4_4_ = fVar159 * auVar276._4_4_;
          auVar192._8_4_ = fVar159 * auVar276._8_4_;
          auVar192._12_4_ = fVar159 * auVar276._12_4_;
          fVar159 = 1.0 / (auVar125._0_4_ - auVar130._0_4_);
          auVar276 = vshufpd_avx(auVar69,auVar69,3);
          auVar9 = vshufpd_avx(auVar210,auVar210,3);
          auVar10 = vshufpd_avx(auVar113,auVar113,3);
          auVar87 = vshufpd_avx(auVar126,auVar126,3);
          auVar276 = vsubps_avx(auVar276,auVar69);
          auVar69 = vsubps_avx(auVar9,auVar210);
          auVar210 = vsubps_avx(auVar10,auVar113);
          auVar87 = vsubps_avx(auVar87,auVar126);
          auVar9 = vminps_avx(auVar276,auVar69);
          auVar276 = vmaxps_avx(auVar276,auVar69);
          auVar10 = vminps_avx(auVar210,auVar87);
          auVar10 = vminps_avx(auVar9,auVar10);
          auVar9 = vmaxps_avx(auVar210,auVar87);
          auVar276 = vmaxps_avx(auVar276,auVar9);
          auVar243._0_4_ = fVar159 * auVar10._0_4_;
          auVar243._4_4_ = fVar159 * auVar10._4_4_;
          auVar243._8_4_ = fVar159 * auVar10._8_4_;
          auVar243._12_4_ = fVar159 * auVar10._12_4_;
          auVar235._0_4_ = fVar159 * auVar276._0_4_;
          auVar235._4_4_ = fVar159 * auVar276._4_4_;
          auVar235._8_4_ = fVar159 * auVar276._8_4_;
          auVar235._12_4_ = fVar159 * auVar276._12_4_;
          auVar10 = vinsertps_avx(auVar12,auVar130,0x10);
          auVar87 = vinsertps_avx(auVar8,auVar125,0x10);
          auVar83._0_4_ = (auVar10._0_4_ + auVar87._0_4_) * 0.5;
          auVar83._4_4_ = (auVar10._4_4_ + auVar87._4_4_) * 0.5;
          auVar83._8_4_ = (auVar10._8_4_ + auVar87._8_4_) * 0.5;
          auVar83._12_4_ = (auVar10._12_4_ + auVar87._12_4_) * 0.5;
          auVar119._4_4_ = auVar83._0_4_;
          auVar119._0_4_ = auVar83._0_4_;
          auVar119._8_4_ = auVar83._0_4_;
          auVar119._12_4_ = auVar83._0_4_;
          auVar8 = vfmadd213ps_fma(local_208,auVar119,local_498);
          auVar276 = vfmadd213ps_fma(local_218,auVar119,local_4a8);
          auVar9 = vfmadd213ps_fma(local_228,auVar119,local_348);
          auVar12 = vsubps_avx(auVar276,auVar8);
          auVar8 = vfmadd213ps_fma(auVar12,auVar119,auVar8);
          auVar12 = vsubps_avx(auVar9,auVar276);
          auVar12 = vfmadd213ps_fma(auVar12,auVar119,auVar276);
          auVar12 = vsubps_avx(auVar12,auVar8);
          auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar119);
          auVar120._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
          auVar120._8_4_ = auVar12._8_4_ * 3.0;
          auVar120._12_4_ = auVar12._12_4_ * 3.0;
          auVar228._8_8_ = auVar8._0_8_;
          auVar228._0_8_ = auVar8._0_8_;
          auVar12 = vshufpd_avx(auVar8,auVar8,3);
          auVar8 = vshufps_avx(auVar83,auVar83,0x55);
          auVar69 = vsubps_avx(auVar12,auVar228);
          auVar113 = vfmadd231ps_fma(auVar228,auVar8,auVar69);
          auVar266._8_8_ = auVar120._0_8_;
          auVar266._0_8_ = auVar120._0_8_;
          auVar12 = vshufpd_avx(auVar120,auVar120,3);
          auVar12 = vsubps_avx(auVar12,auVar266);
          auVar210 = vfmadd213ps_fma(auVar12,auVar8,auVar266);
          auVar8 = vmovshdup_avx(auVar210);
          auVar267._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
          auVar267._8_4_ = auVar8._8_4_ ^ 0x80000000;
          auVar267._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar276 = vmovshdup_avx(auVar69);
          auVar12 = vunpcklps_avx(auVar276,auVar267);
          auVar9 = vshufps_avx(auVar12,auVar267,4);
          auVar284._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar69._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar69._12_4_ ^ 0x80000000;
          auVar12 = vmovlhps_avx(auVar284,auVar210);
          auVar12 = vshufps_avx(auVar12,auVar210,8);
          auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar69._0_4_)),auVar276,auVar210);
          auVar135._0_4_ = auVar8._0_4_;
          auVar135._4_4_ = auVar135._0_4_;
          auVar135._8_4_ = auVar135._0_4_;
          auVar135._12_4_ = auVar135._0_4_;
          auVar8 = vdivps_avx(auVar9,auVar135);
          auVar276 = vdivps_avx(auVar12,auVar135);
          fVar112 = auVar113._0_4_;
          fVar159 = auVar8._0_4_;
          auVar12 = vshufps_avx(auVar113,auVar113,0x55);
          fVar161 = auVar276._0_4_;
          local_408._4_4_ = fVar112 * auVar8._4_4_ + auVar12._4_4_ * auVar276._4_4_;
          local_408._0_4_ = fVar112 * fVar159 + auVar12._0_4_ * fVar161;
          uStack_400._0_4_ = fVar112 * auVar8._8_4_ + auVar12._8_4_ * auVar276._8_4_;
          uStack_400._4_4_ = fVar112 * auVar8._12_4_ + auVar12._12_4_ * auVar276._12_4_;
          auVar69 = vmovshdup_avx(auVar8);
          auVar12 = vinsertps_avx(auVar213,auVar243,0x1c);
          auVar277._0_4_ = auVar69._0_4_ * auVar12._0_4_;
          auVar277._4_4_ = auVar69._4_4_ * auVar12._4_4_;
          auVar277._8_4_ = auVar69._8_4_ * auVar12._8_4_;
          auVar277._12_4_ = auVar69._12_4_ * auVar12._12_4_;
          auVar9 = vinsertps_avx(auVar192,auVar235,0x1c);
          auVar253._0_4_ = auVar69._0_4_ * auVar9._0_4_;
          auVar253._4_4_ = auVar69._4_4_ * auVar9._4_4_;
          auVar253._8_4_ = auVar69._8_4_ * auVar9._8_4_;
          auVar253._12_4_ = auVar69._12_4_ * auVar9._12_4_;
          auVar126 = vminps_avx(auVar277,auVar253);
          auVar113 = vmaxps_avx(auVar253,auVar277);
          auVar69 = vinsertps_avx(auVar243,auVar213,0x4c);
          auVar68 = vmovshdup_avx(auVar276);
          auVar210 = vinsertps_avx(auVar235,auVar192,0x4c);
          auVar236._0_4_ = auVar68._0_4_ * auVar69._0_4_;
          auVar236._4_4_ = auVar68._4_4_ * auVar69._4_4_;
          auVar236._8_4_ = auVar68._8_4_ * auVar69._8_4_;
          auVar236._12_4_ = auVar68._12_4_ * auVar69._12_4_;
          auVar244._0_4_ = auVar68._0_4_ * auVar210._0_4_;
          auVar244._4_4_ = auVar68._4_4_ * auVar210._4_4_;
          auVar244._8_4_ = auVar68._8_4_ * auVar210._8_4_;
          auVar244._12_4_ = auVar68._12_4_ * auVar210._12_4_;
          auVar68 = vminps_avx(auVar236,auVar244);
          auVar92._0_4_ = auVar68._0_4_ + auVar126._0_4_;
          auVar92._4_4_ = auVar68._4_4_ + auVar126._4_4_;
          auVar92._8_4_ = auVar68._8_4_ + auVar126._8_4_;
          auVar92._12_4_ = auVar68._12_4_ + auVar126._12_4_;
          auVar126 = vmaxps_avx(auVar244,auVar236);
          auVar237._0_4_ = auVar113._0_4_ + auVar126._0_4_;
          auVar237._4_4_ = auVar113._4_4_ + auVar126._4_4_;
          auVar237._8_4_ = auVar113._8_4_ + auVar126._8_4_;
          auVar237._12_4_ = auVar113._12_4_ + auVar126._12_4_;
          auVar245._8_8_ = 0x3f80000000000000;
          auVar245._0_8_ = 0x3f80000000000000;
          auVar113 = vsubps_avx(auVar245,auVar237);
          auVar126 = vsubps_avx(auVar245,auVar92);
          auVar68 = vsubps_avx(auVar10,auVar83);
          auVar268._0_4_ = fVar159 * auVar12._0_4_;
          auVar268._4_4_ = fVar159 * auVar12._4_4_;
          auVar268._8_4_ = fVar159 * auVar12._8_4_;
          auVar268._12_4_ = fVar159 * auVar12._12_4_;
          auVar254._0_4_ = fVar159 * auVar9._0_4_;
          auVar254._4_4_ = fVar159 * auVar9._4_4_;
          auVar254._8_4_ = fVar159 * auVar9._8_4_;
          auVar254._12_4_ = fVar159 * auVar9._12_4_;
          auVar9 = vminps_avx(auVar268,auVar254);
          auVar12 = vmaxps_avx(auVar254,auVar268);
          auVar214._0_4_ = fVar161 * auVar69._0_4_;
          auVar214._4_4_ = fVar161 * auVar69._4_4_;
          auVar214._8_4_ = fVar161 * auVar69._8_4_;
          auVar214._12_4_ = fVar161 * auVar69._12_4_;
          auVar193._0_4_ = fVar161 * auVar210._0_4_;
          auVar193._4_4_ = fVar161 * auVar210._4_4_;
          auVar193._8_4_ = fVar161 * auVar210._8_4_;
          auVar193._12_4_ = fVar161 * auVar210._12_4_;
          auVar69 = vminps_avx(auVar214,auVar193);
          auVar269._0_4_ = auVar9._0_4_ + auVar69._0_4_;
          auVar269._4_4_ = auVar9._4_4_ + auVar69._4_4_;
          auVar269._8_4_ = auVar9._8_4_ + auVar69._8_4_;
          auVar269._12_4_ = auVar9._12_4_ + auVar69._12_4_;
          auVar69 = vsubps_avx(auVar87,auVar83);
          auVar9 = vmaxps_avx(auVar193,auVar214);
          fVar112 = auVar68._0_4_;
          auVar215._0_4_ = fVar112 * auVar113._0_4_;
          fVar67 = auVar68._4_4_;
          auVar215._4_4_ = fVar67 * auVar113._4_4_;
          fVar142 = auVar68._8_4_;
          auVar215._8_4_ = fVar142 * auVar113._8_4_;
          fVar179 = auVar68._12_4_;
          auVar215._12_4_ = fVar179 * auVar113._12_4_;
          auVar194._0_4_ = auVar12._0_4_ + auVar9._0_4_;
          auVar194._4_4_ = auVar12._4_4_ + auVar9._4_4_;
          auVar194._8_4_ = auVar12._8_4_ + auVar9._8_4_;
          auVar194._12_4_ = auVar12._12_4_ + auVar9._12_4_;
          auVar255._8_8_ = 0x3f800000;
          auVar255._0_8_ = 0x3f800000;
          auVar12 = vsubps_avx(auVar255,auVar194);
          auVar9 = vsubps_avx(auVar255,auVar269);
          auVar270._0_4_ = fVar112 * auVar126._0_4_;
          auVar270._4_4_ = fVar67 * auVar126._4_4_;
          auVar270._8_4_ = fVar142 * auVar126._8_4_;
          auVar270._12_4_ = fVar179 * auVar126._12_4_;
          fVar162 = auVar69._0_4_;
          auVar238._0_4_ = fVar162 * auVar113._0_4_;
          fVar163 = auVar69._4_4_;
          auVar238._4_4_ = fVar163 * auVar113._4_4_;
          fVar140 = auVar69._8_4_;
          auVar238._8_4_ = fVar140 * auVar113._8_4_;
          fVar156 = auVar69._12_4_;
          auVar238._12_4_ = fVar156 * auVar113._12_4_;
          auVar93._0_4_ = fVar162 * auVar126._0_4_;
          auVar93._4_4_ = fVar163 * auVar126._4_4_;
          auVar93._8_4_ = fVar140 * auVar126._8_4_;
          auVar93._12_4_ = fVar156 * auVar126._12_4_;
          auVar285._0_4_ = fVar112 * auVar12._0_4_;
          auVar285._4_4_ = fVar67 * auVar12._4_4_;
          auVar285._8_4_ = fVar142 * auVar12._8_4_;
          auVar285._12_4_ = fVar179 * auVar12._12_4_;
          auVar246._0_4_ = fVar112 * auVar9._0_4_;
          auVar246._4_4_ = fVar67 * auVar9._4_4_;
          auVar246._8_4_ = fVar142 * auVar9._8_4_;
          auVar246._12_4_ = fVar179 * auVar9._12_4_;
          auVar195._0_4_ = fVar162 * auVar12._0_4_;
          auVar195._4_4_ = fVar163 * auVar12._4_4_;
          auVar195._8_4_ = fVar140 * auVar12._8_4_;
          auVar195._12_4_ = fVar156 * auVar12._12_4_;
          auVar256._0_4_ = fVar162 * auVar9._0_4_;
          auVar256._4_4_ = fVar163 * auVar9._4_4_;
          auVar256._8_4_ = fVar140 * auVar9._8_4_;
          auVar256._12_4_ = fVar156 * auVar9._12_4_;
          auVar12 = vminps_avx(auVar285,auVar246);
          auVar9 = vminps_avx(auVar195,auVar256);
          auVar12 = vminps_avx(auVar12,auVar9);
          auVar9 = vmaxps_avx(auVar246,auVar285);
          auVar69 = vminps_avx(auVar215,auVar270);
          auVar210 = vminps_avx(auVar238,auVar93);
          auVar69 = vminps_avx(auVar69,auVar210);
          auVar12 = vhaddps_avx(auVar12,auVar69);
          auVar69 = vmaxps_avx(auVar256,auVar195);
          auVar9 = vmaxps_avx(auVar69,auVar9);
          auVar69 = vmaxps_avx(auVar270,auVar215);
          auVar210 = vmaxps_avx(auVar93,auVar238);
          auVar69 = vmaxps_avx(auVar210,auVar69);
          auVar9 = vhaddps_avx(auVar9,auVar69);
          auVar69 = vshufps_avx(auVar83,auVar83,0x54);
          auVar69 = vsubps_avx(auVar69,_local_408);
          auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
          auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
          auVar216._0_4_ = auVar69._0_4_ + auVar12._0_4_;
          auVar216._4_4_ = auVar69._4_4_ + auVar12._4_4_;
          auVar216._8_4_ = auVar69._8_4_ + auVar12._8_4_;
          auVar216._12_4_ = auVar69._12_4_ + auVar12._12_4_;
          auVar196._0_4_ = auVar69._0_4_ + auVar9._0_4_;
          auVar196._4_4_ = auVar69._4_4_ + auVar9._4_4_;
          auVar196._8_4_ = auVar69._8_4_ + auVar9._8_4_;
          auVar196._12_4_ = auVar69._12_4_ + auVar9._12_4_;
          auVar12 = vmaxps_avx(auVar10,auVar216);
          auVar9 = vminps_avx(auVar196,auVar87);
          auVar12 = vcmpps_avx(auVar9,auVar12,1);
          auVar12 = vshufps_avx(auVar12,auVar12,0x50);
          local_4c8 = vinsertps_avx(auVar130,ZEXT416((uint)auVar125._0_4_),0x10);
          if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar12[0xf] < '\0') goto LAB_016a984e;
          bVar60 = 0;
          if ((fVar157 < auVar216._0_4_) && (bVar60 = 0, auVar196._0_4_ < auVar87._0_4_)) {
            auVar9 = vmovshdup_avx(auVar216);
            auVar12 = vcmpps_avx(auVar196,auVar87,1);
            bVar60 = auVar12[4] & auVar130._0_4_ < auVar9._0_4_;
          }
          if (((3 < (uint)uVar57 || fVar141 < 0.001) | bVar60) == 1) {
            lVar59 = 200;
            do {
              fVar67 = auVar69._0_4_;
              fVar112 = 1.0 - fVar67;
              fVar141 = fVar112 * fVar112 * fVar112;
              fVar157 = fVar67 * 3.0 * fVar112 * fVar112;
              fVar112 = fVar112 * fVar67 * fVar67 * 3.0;
              auVar153._4_4_ = fVar141;
              auVar153._0_4_ = fVar141;
              auVar153._8_4_ = fVar141;
              auVar153._12_4_ = fVar141;
              auVar106._4_4_ = fVar157;
              auVar106._0_4_ = fVar157;
              auVar106._8_4_ = fVar157;
              auVar106._12_4_ = fVar157;
              auVar94._4_4_ = fVar112;
              auVar94._0_4_ = fVar112;
              auVar94._8_4_ = fVar112;
              auVar94._12_4_ = fVar112;
              fVar67 = fVar67 * fVar67 * fVar67;
              auVar174._0_4_ = (float)local_238._0_4_ * fVar67;
              auVar174._4_4_ = (float)local_238._4_4_ * fVar67;
              auVar174._8_4_ = fStack_230 * fVar67;
              auVar174._12_4_ = fStack_22c * fVar67;
              auVar12 = vfmadd231ps_fma(auVar174,local_348,auVar94);
              auVar12 = vfmadd231ps_fma(auVar12,local_4a8,auVar106);
              auVar12 = vfmadd231ps_fma(auVar12,local_498,auVar153);
              auVar95._8_8_ = auVar12._0_8_;
              auVar95._0_8_ = auVar12._0_8_;
              auVar12 = vshufpd_avx(auVar12,auVar12,3);
              auVar9 = vshufps_avx(auVar69,auVar69,0x55);
              auVar12 = vsubps_avx(auVar12,auVar95);
              auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar95);
              fVar141 = auVar9._0_4_;
              auVar12 = vshufps_avx(auVar9,auVar9,0x55);
              auVar96._0_4_ = fVar159 * fVar141 + fVar161 * auVar12._0_4_;
              auVar96._4_4_ = auVar8._4_4_ * fVar141 + auVar276._4_4_ * auVar12._4_4_;
              auVar96._8_4_ = auVar8._8_4_ * fVar141 + auVar276._8_4_ * auVar12._8_4_;
              auVar96._12_4_ = auVar8._12_4_ * fVar141 + auVar276._12_4_ * auVar12._12_4_;
              auVar69 = vsubps_avx(auVar69,auVar96);
              auVar12 = vandps_avx(local_358,auVar9);
              auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
              auVar12 = vmaxss_avx(auVar9,auVar12);
              if (auVar12._0_4_ < (float)local_448._0_4_) {
                fVar141 = auVar69._0_4_;
                if ((0.0 <= fVar141) && (fVar141 <= 1.0)) {
                  auVar12 = vmovshdup_avx(auVar69);
                  fVar157 = auVar12._0_4_;
                  if ((0.0 <= fVar157) && (fVar157 <= 1.0)) {
                    auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar113 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar1 = (ray->org).field_0;
                    auVar12 = vsubps_avx(local_378,(undefined1  [16])aVar1);
                    auVar12 = vdpps_avx(auVar12,auVar113,0x7f);
                    auVar8 = vsubps_avx(local_3a8,(undefined1  [16])aVar1);
                    auVar8 = vdpps_avx(auVar8,auVar113,0x7f);
                    auVar276 = vsubps_avx(local_3b8,(undefined1  [16])aVar1);
                    auVar276 = vdpps_avx(auVar276,auVar113,0x7f);
                    auVar9 = vsubps_avx(local_398,(undefined1  [16])aVar1);
                    auVar9 = vdpps_avx(auVar9,auVar113,0x7f);
                    auVar10 = vsubps_avx(_local_388,(undefined1  [16])aVar1);
                    auVar10 = vdpps_avx(auVar10,auVar113,0x7f);
                    auVar87 = vsubps_avx(_local_3c8,(undefined1  [16])aVar1);
                    auVar87 = vdpps_avx(auVar87,auVar113,0x7f);
                    auVar210 = vsubps_avx(_local_3d8,(undefined1  [16])aVar1);
                    auVar210 = vdpps_avx(auVar210,auVar113,0x7f);
                    auVar48._4_4_ = fStack_3e4;
                    auVar48._0_4_ = local_3e8;
                    auVar48._8_4_ = fStack_3e0;
                    auVar48._12_4_ = fStack_3dc;
                    auVar126 = vsubps_avx(auVar48,(undefined1  [16])aVar1);
                    auVar113 = vdpps_avx(auVar126,auVar113,0x7f);
                    fVar159 = 1.0 - fVar157;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar157)),
                                              ZEXT416((uint)fVar159),auVar12);
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ * fVar157)),
                                             ZEXT416((uint)fVar159),auVar8);
                    auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar210._0_4_ * fVar157)),
                                               ZEXT416((uint)fVar159),auVar276);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * auVar113._0_4_)),
                                             ZEXT416((uint)fVar159),auVar9);
                    fVar112 = 1.0 - fVar141;
                    fVar157 = fVar112 * fVar141 * fVar141 * 3.0;
                    fVar142 = fVar141 * fVar141 * fVar141;
                    auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar142)),
                                               ZEXT416((uint)fVar157),auVar276);
                    fVar159 = fVar141 * 3.0 * fVar112 * fVar112;
                    auVar8 = vfmadd231ss_fma(auVar276,ZEXT416((uint)fVar159),auVar8);
                    fVar161 = fVar112 * fVar112 * fVar112;
                    auVar12 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar161),auVar12);
                    fVar67 = auVar12._0_4_;
                    if ((ray->org).field_0.m128[3] <= fVar67) {
                      local_408._0_4_ = ray->tfar;
                      if (fVar67 <= ray->tfar) {
                        _fStack_420 = auVar13._8_24_;
                        local_428 = auVar63;
                        pGVar4 = (context->scene->geometries).items[uVar54].ptr;
                        if ((pGVar4->mask & ray->mask) == 0) {
                          bVar53 = false;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar53 = true, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                ) {
                          auVar12 = vshufps_avx(auVar69,auVar69,0x55);
                          auVar217._8_4_ = 0x3f800000;
                          auVar217._0_8_ = &DAT_3f8000003f800000;
                          auVar217._12_4_ = 0x3f800000;
                          auVar8 = vsubps_avx(auVar217,auVar12);
                          fVar179 = auVar12._0_4_;
                          auVar229._0_4_ = fVar179 * (float)local_388._0_4_;
                          fVar162 = auVar12._4_4_;
                          auVar229._4_4_ = fVar162 * (float)local_388._4_4_;
                          fVar163 = auVar12._8_4_;
                          auVar229._8_4_ = fVar163 * fStack_380;
                          fVar140 = auVar12._12_4_;
                          auVar229._12_4_ = fVar140 * fStack_37c;
                          auVar239._0_4_ = fVar179 * (float)local_3c8._0_4_;
                          auVar239._4_4_ = fVar162 * (float)local_3c8._4_4_;
                          auVar239._8_4_ = fVar163 * fStack_3c0;
                          auVar239._12_4_ = fVar140 * fStack_3bc;
                          auVar247._0_4_ = fVar179 * (float)local_3d8._0_4_;
                          auVar247._4_4_ = fVar162 * (float)local_3d8._4_4_;
                          auVar247._8_4_ = fVar163 * fStack_3d0;
                          auVar247._12_4_ = fVar140 * fStack_3cc;
                          auVar197._0_4_ = fVar179 * local_3e8;
                          auVar197._4_4_ = fVar162 * fStack_3e4;
                          auVar197._8_4_ = fVar163 * fStack_3e0;
                          auVar197._12_4_ = fVar140 * fStack_3dc;
                          auVar12 = vfmadd231ps_fma(auVar229,auVar8,local_378);
                          auVar276 = vfmadd231ps_fma(auVar239,auVar8,local_3a8);
                          auVar9 = vfmadd231ps_fma(auVar247,auVar8,local_3b8);
                          auVar10 = vfmadd231ps_fma(auVar197,auVar8,local_398);
                          auVar12 = vsubps_avx(auVar276,auVar12);
                          auVar8 = vsubps_avx(auVar9,auVar276);
                          auVar276 = vsubps_avx(auVar10,auVar9);
                          auVar248._0_4_ = fVar141 * auVar8._0_4_;
                          auVar248._4_4_ = fVar141 * auVar8._4_4_;
                          auVar248._8_4_ = fVar141 * auVar8._8_4_;
                          auVar248._12_4_ = fVar141 * auVar8._12_4_;
                          auVar175._4_4_ = fVar112;
                          auVar175._0_4_ = fVar112;
                          auVar175._8_4_ = fVar112;
                          auVar175._12_4_ = fVar112;
                          auVar12 = vfmadd231ps_fma(auVar248,auVar175,auVar12);
                          auVar198._0_4_ = fVar141 * auVar276._0_4_;
                          auVar198._4_4_ = fVar141 * auVar276._4_4_;
                          auVar198._8_4_ = fVar141 * auVar276._8_4_;
                          auVar198._12_4_ = fVar141 * auVar276._12_4_;
                          auVar8 = vfmadd231ps_fma(auVar198,auVar175,auVar8);
                          auVar199._0_4_ = fVar141 * auVar8._0_4_;
                          auVar199._4_4_ = fVar141 * auVar8._4_4_;
                          auVar199._8_4_ = fVar141 * auVar8._8_4_;
                          auVar199._12_4_ = fVar141 * auVar8._12_4_;
                          auVar8 = vfmadd231ps_fma(auVar199,auVar175,auVar12);
                          auVar154._0_4_ = fVar142 * (float)local_298._0_4_;
                          auVar154._4_4_ = fVar142 * (float)local_298._4_4_;
                          auVar154._8_4_ = fVar142 * fStack_290;
                          auVar154._12_4_ = fVar142 * fStack_28c;
                          auVar107._4_4_ = fVar157;
                          auVar107._0_4_ = fVar157;
                          auVar107._8_4_ = fVar157;
                          auVar107._12_4_ = fVar157;
                          auVar12 = vfmadd132ps_fma(auVar107,auVar154,local_288);
                          auVar136._4_4_ = fVar159;
                          auVar136._0_4_ = fVar159;
                          auVar136._8_4_ = fVar159;
                          auVar136._12_4_ = fVar159;
                          auVar12 = vfmadd132ps_fma(auVar136,auVar12,local_278);
                          auVar108._0_4_ = auVar8._0_4_ * 3.0;
                          auVar108._4_4_ = auVar8._4_4_ * 3.0;
                          auVar108._8_4_ = auVar8._8_4_ * 3.0;
                          auVar108._12_4_ = auVar8._12_4_ * 3.0;
                          auVar121._4_4_ = fVar161;
                          auVar121._0_4_ = fVar161;
                          auVar121._8_4_ = fVar161;
                          auVar121._12_4_ = fVar161;
                          auVar8 = vfmadd132ps_fma(auVar121,auVar12,local_268);
                          auVar12 = vshufps_avx(auVar108,auVar108,0xc9);
                          auVar137._0_4_ = auVar8._0_4_ * auVar12._0_4_;
                          auVar137._4_4_ = auVar8._4_4_ * auVar12._4_4_;
                          auVar137._8_4_ = auVar8._8_4_ * auVar12._8_4_;
                          auVar137._12_4_ = auVar8._12_4_ * auVar12._12_4_;
                          auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
                          auVar8 = vfmsub231ps_fma(auVar137,auVar108,auVar12);
                          auVar12 = vshufps_avx(auVar8,auVar8,0xe9);
                          local_2c8 = vmovlps_avx(auVar12);
                          local_2c0 = auVar8._0_4_;
                          local_2bc = vmovlps_avx(auVar69);
                          local_2b4 = (int)local_330;
                          local_2b0 = uVar54;
                          local_2ac = context->user->instID[0];
                          local_2a8 = context->user->instPrimID[0];
                          ray->tfar = fVar67;
                          local_4ac = -1;
                          local_328.valid = &local_4ac;
                          local_328.geometryUserPtr = pGVar4->userPtr;
                          local_328.context = context->user;
                          local_328.hit = (RTCHitN *)&local_2c8;
                          local_328.N = 1;
                          local_328.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016a973e:
                            p_Var7 = context->args->filter;
                            if (p_Var7 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var7)(&local_328);
                              }
                              if (*local_328.valid == 0) {
                                bVar53 = false;
                                goto LAB_016a987f;
                              }
                            }
                            bVar53 = true;
                          }
                          else {
                            local_2f8._0_8_ = context;
                            (*pGVar4->occlusionFilterN)(&local_328);
                            context = (RayQueryContext *)local_2f8._0_8_;
                            if (*local_328.valid != 0) goto LAB_016a973e;
                            bVar53 = false;
                          }
LAB_016a987f:
                          if (!bVar53) {
                            ray->tfar = (float)local_408._0_4_;
                          }
                        }
                        bVar52 = (bool)(bVar52 | bVar53);
                        auVar63 = local_428;
                      }
                    }
                  }
                }
                break;
              }
              lVar59 = lVar59 + -1;
            } while (lVar59 != 0);
          }
          else {
            bVar43 = false;
          }
        }
      }
      auVar280 = ZEXT464(0x3f800000);
      auVar12 = local_468._0_16_;
    } while (bVar43);
    local_468._0_16_ = auVar12;
    local_248 = vinsertps_avx(local_468._0_16_,ZEXT416((uint)local_488),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }